

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O1

void capnp::_::anon_unknown_133::dynamicCheckTestMessageAllZero<capnp::DynamicStruct::Reader>
               (Reader reader)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  ReaderFor<bool> RVar53;
  int8_t iVar54;
  uint8_t uVar55;
  bool bVar56;
  int16_t iVar57;
  uint16_t uVar58;
  uint uVar59;
  int32_t iVar60;
  uint32_t uVar61;
  StructSchema SVar62;
  uchar *puVar63;
  size_t sVar64;
  float fVar65;
  double dVar66;
  float fVar67;
  double dVar68;
  StringPtr name;
  StringPtr name_00;
  StringPtr name_01;
  StringPtr name_02;
  StringPtr name_03;
  StringPtr name_04;
  StringPtr name_05;
  StringPtr name_06;
  StringPtr name_07;
  StringPtr name_08;
  StringPtr name_09;
  StringPtr name_10;
  StringPtr name_11;
  StringPtr name_12;
  StringPtr name_13;
  StringPtr name_14;
  StringPtr name_15;
  StringPtr name_16;
  StringPtr name_17;
  StringPtr name_18;
  StringPtr name_19;
  StringPtr name_20;
  StringPtr name_21;
  StringPtr name_22;
  StringPtr name_23;
  StringPtr name_24;
  StringPtr name_25;
  StringPtr name_26;
  StringPtr name_27;
  StringPtr name_28;
  StringPtr name_29;
  StringPtr name_30;
  StringPtr name_31;
  StringPtr name_32;
  StringPtr name_33;
  StringPtr name_34;
  StringPtr name_35;
  StringPtr name_36;
  StringPtr name_37;
  StringPtr name_38;
  StringPtr name_39;
  StringPtr name_40;
  StringPtr name_41;
  StringPtr name_42;
  StringPtr name_43;
  StringPtr name_44;
  StringPtr name_45;
  StringPtr name_46;
  StringPtr name_47;
  StringPtr name_48;
  StringPtr name_49;
  StringPtr name_50;
  StringPtr name_51;
  StringPtr name_52;
  StringPtr name_53;
  StringPtr name_54;
  StringPtr name_55;
  StringPtr name_56;
  StringPtr name_57;
  StringPtr name_58;
  StringPtr name_59;
  StringPtr name_60;
  StringPtr name_61;
  StringPtr name_62;
  StringPtr name_63;
  StringPtr name_64;
  StringPtr name_65;
  StringPtr name_66;
  StringPtr name_67;
  StringPtr name_68;
  StringPtr name_69;
  StringPtr name_70;
  StringPtr name_71;
  StringPtr name_72;
  StringPtr name_73;
  StringPtr name_74;
  StringPtr name_75;
  StringPtr name_76;
  StringPtr name_77;
  StringPtr name_78;
  StringPtr name_79;
  StringPtr name_80;
  StringPtr name_81;
  StringPtr name_82;
  StringPtr name_83;
  StringPtr name_84;
  StringPtr name_85;
  StringPtr name_86;
  StringPtr name_87;
  StringPtr name_88;
  StringPtr name_89;
  StringPtr name_90;
  StringPtr name_91;
  StringPtr name_92;
  StringPtr name_93;
  StringPtr name_94;
  StringPtr name_95;
  StringPtr name_96;
  StringPtr name_97;
  StringPtr name_98;
  StringPtr name_99;
  StringPtr name_x00100;
  StringPtr name_x00101;
  StringPtr name_x00102;
  StringPtr name_x00103;
  StringPtr name_x00104;
  StringPtr name_x00105;
  StringPtr name_x00106;
  StringPtr name_x00107;
  StringPtr name_x00108;
  StringPtr name_x00109;
  StringPtr name_x00110;
  StringPtr name_x00111;
  StringPtr name_x00112;
  StringPtr name_x00113;
  StringPtr name_x00114;
  StringPtr name_x00115;
  StringPtr name_x00116;
  StringPtr name_x00117;
  StringPtr name_x00118;
  StringPtr name_x00119;
  StringPtr name_x00120;
  Reader local_1b0;
  DebugComparison<const_capnp::Void_&,_capnp::Void> _kjCondition;
  undefined1 local_140;
  ReaderFor<capnp::DynamicStruct> subReader;
  DebugExpression<bool> _kjCondition_10;
  undefined1 auStack_e7 [7];
  char *local_e0;
  DebugExpression<bool> _kjCondition_23;
  undefined1 auStack_af [15];
  undefined1 auStack_ac [12];
  DebugComparison<const_char_(&)[1],_capnp::Text::Reader> _kjCondition_27;
  char *local_48;
  ArrayPtr<const_char> local_40;
  
  name.content.size_ = 10;
  name.content.ptr = "voidField";
  DynamicStruct::Reader::get(&local_1b0,&reader,name);
  DynamicValue::Reader::AsImpl<capnp::Void,_(capnp::Kind)0>::apply(&local_1b0);
  _kjCondition.left = (Void *)&VOID;
  _kjCondition.op.content.size_ = 5;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.result = true;
  DynamicValue::Reader::~Reader(&local_1b0);
  if ((_kjCondition.result == false) && (kj::_::Debug::minSeverity < 3)) {
    name_00.content.size_ = 10;
    name_00.content.ptr = "voidField";
    DynamicStruct::Reader::get(&local_1b0,&reader,name_00);
    DynamicValue::Reader::AsImpl<capnp::Void,_(capnp::Kind)0>::apply(&local_1b0);
    kj::_::Debug::
    log<char_const(&)[73],kj::_::DebugComparison<capnp::Void_const&,capnp::Void>&,capnp::Void_const&,capnp::Void>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x211,ERROR,
               "\"failed: expected \" \"(VOID) == (reader.get(\\\"voidField\\\").template as<Void>())\", _kjCondition, VOID, reader.get(\"voidField\").template as<Void>()"
               ,(char (*) [73])
                "failed: expected (VOID) == (reader.get(\"voidField\").template as<Void>())",
               &_kjCondition,(Void *)&VOID,(Void *)&subReader);
    DynamicValue::Reader::~Reader(&local_1b0);
  }
  name_01.content.size_ = 10;
  name_01.content.ptr = "boolField";
  DynamicStruct::Reader::get(&local_1b0,&reader,name_01);
  RVar53 = DynamicValue::Reader::AsImpl<bool,_(capnp::Kind)0>::apply(&local_1b0);
  _kjCondition.left = (Void *)((ulong)CONCAT61(_kjCondition.left._2_6_,RVar53) << 8);
  _kjCondition._8_8_ = anon_var_dwarf_a9f8;
  _kjCondition.op.content.size_._0_1_ = !RVar53;
  _kjCondition.op.content.ptr = &DAT_00000005;
  DynamicValue::Reader::~Reader(&local_1b0);
  if (((char)_kjCondition.op.content.size_ == '\0') && (kj::_::Debug::minSeverity < 3)) {
    auVar1[0xf] = 0;
    auVar1._0_15_ = (undefined1  [15])subReader._1_15_;
    subReader._0_16_ = auVar1 << 8;
    name_02.content.size_ = 10;
    name_02.content.ptr = "boolField";
    DynamicStruct::Reader::get(&local_1b0,&reader,name_02);
    _kjCondition_10.value = DynamicValue::Reader::AsImpl<bool,_(capnp::Kind)0>::apply(&local_1b0);
    kj::_::Debug::log<char_const(&)[74],kj::_::DebugComparison<bool,bool>&,bool,bool>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x212,ERROR,
               "\"failed: expected \" \"(false) == (reader.get(\\\"boolField\\\").template as<bool>())\", _kjCondition, false, reader.get(\"boolField\").template as<bool>()"
               ,(char (*) [74])
                "failed: expected (false) == (reader.get(\"boolField\").template as<bool>())",
               (DebugComparison<bool,_bool> *)&_kjCondition,(bool *)&subReader,
               &_kjCondition_10.value);
    DynamicValue::Reader::~Reader(&local_1b0);
  }
  name_03.content.size_ = 10;
  name_03.content.ptr = "int8Field";
  DynamicStruct::Reader::get(&local_1b0,&reader,name_03);
  iVar54 = DynamicValue::Reader::AsImpl<signed_char,_(capnp::Kind)0>::apply(&local_1b0);
  _kjCondition.left = (Void *)((ulong)CONCAT31(_kjCondition.left._5_3_,iVar54) << 0x20);
  _kjCondition._8_8_ = anon_var_dwarf_a9f8;
  _kjCondition.op.content.size_._0_1_ = iVar54 == '\0';
  _kjCondition.op.content.ptr = &DAT_00000005;
  DynamicValue::Reader::~Reader(&local_1b0);
  if (((char)_kjCondition.op.content.size_ == '\0') && (kj::_::Debug::minSeverity < 3)) {
    auVar2._12_4_ = 0;
    auVar2._0_12_ = (undefined1  [12])subReader._4_12_;
    subReader._0_16_ = auVar2 << 0x20;
    name_04.content.size_ = 10;
    name_04.content.ptr = "int8Field";
    DynamicStruct::Reader::get(&local_1b0,&reader,name_04);
    iVar54 = DynamicValue::Reader::AsImpl<signed_char,_(capnp::Kind)0>::apply(&local_1b0);
    _kjCondition_10.value = (bool)iVar54;
    kj::_::Debug::log<char_const(&)[72],kj::_::DebugComparison<int,signed_char>&,int,signed_char>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x213,ERROR,
               "\"failed: expected \" \"(0) == (reader.get(\\\"int8Field\\\").template as<int8_t>())\", _kjCondition, 0, reader.get(\"int8Field\").template as<int8_t>()"
               ,(char (*) [72])
                "failed: expected (0) == (reader.get(\"int8Field\").template as<int8_t>())",
               (DebugComparison<int,_signed_char> *)&_kjCondition,(int *)&subReader,
               &_kjCondition_10.value);
    DynamicValue::Reader::~Reader(&local_1b0);
  }
  name_05.content.size_ = 0xb;
  name_05.content.ptr = "int16Field";
  DynamicStruct::Reader::get(&local_1b0,&reader,name_05);
  iVar57 = DynamicValue::Reader::AsImpl<short,_(capnp::Kind)0>::apply(&local_1b0);
  _kjCondition.left = (Void *)((ulong)CONCAT22(_kjCondition.left._6_2_,iVar57) << 0x20);
  _kjCondition._8_8_ = anon_var_dwarf_a9f8;
  _kjCondition.op.content.size_._0_1_ = iVar57 == 0;
  _kjCondition.op.content.ptr = &DAT_00000005;
  DynamicValue::Reader::~Reader(&local_1b0);
  if (((char)_kjCondition.op.content.size_ == '\0') && (kj::_::Debug::minSeverity < 3)) {
    auVar3._12_4_ = 0;
    auVar3._0_12_ = (undefined1  [12])subReader._4_12_;
    subReader._0_16_ = auVar3 << 0x20;
    name_06.content.size_ = 0xb;
    name_06.content.ptr = "int16Field";
    DynamicStruct::Reader::get(&local_1b0,&reader,name_06);
    iVar57 = DynamicValue::Reader::AsImpl<short,_(capnp::Kind)0>::apply(&local_1b0);
    __kjCondition_10 = iVar57;
    kj::_::Debug::log<char_const(&)[74],kj::_::DebugComparison<int,short>&,int,short>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x214,ERROR,
               "\"failed: expected \" \"(0) == (reader.get(\\\"int16Field\\\").template as<int16_t>())\", _kjCondition, 0, reader.get(\"int16Field\").template as<int16_t>()"
               ,(char (*) [74])
                "failed: expected (0) == (reader.get(\"int16Field\").template as<int16_t>())",
               (DebugComparison<int,_short> *)&_kjCondition,(int *)&subReader,
               (short *)&_kjCondition_10);
    DynamicValue::Reader::~Reader(&local_1b0);
  }
  name_07.content.size_ = 0xb;
  name_07.content.ptr = "int32Field";
  DynamicStruct::Reader::get(&local_1b0,&reader,name_07);
  uVar59 = DynamicValue::Reader::AsImpl<int,_(capnp::Kind)0>::apply(&local_1b0);
  _kjCondition.left = (Void *)((ulong)uVar59 << 0x20);
  _kjCondition._8_8_ = anon_var_dwarf_a9f8;
  _kjCondition.op.content.size_._0_1_ = uVar59 == 0;
  _kjCondition.op.content.ptr = &DAT_00000005;
  DynamicValue::Reader::~Reader(&local_1b0);
  if (((char)_kjCondition.op.content.size_ == '\0') && (kj::_::Debug::minSeverity < 3)) {
    auVar4._12_4_ = 0;
    auVar4._0_12_ = (undefined1  [12])subReader._4_12_;
    subReader._0_16_ = auVar4 << 0x20;
    name_08.content.size_ = 0xb;
    name_08.content.ptr = "int32Field";
    DynamicStruct::Reader::get(&local_1b0,&reader,name_08);
    iVar60 = DynamicValue::Reader::AsImpl<int,_(capnp::Kind)0>::apply(&local_1b0);
    __kjCondition_10 = iVar60;
    kj::_::Debug::log<char_const(&)[74],kj::_::DebugComparison<int,int>&,int,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x215,ERROR,
               "\"failed: expected \" \"(0) == (reader.get(\\\"int32Field\\\").template as<int32_t>())\", _kjCondition, 0, reader.get(\"int32Field\").template as<int32_t>()"
               ,(char (*) [74])
                "failed: expected (0) == (reader.get(\"int32Field\").template as<int32_t>())",
               (DebugComparison<int,_int> *)&_kjCondition,(int *)&subReader,(int *)&_kjCondition_10)
    ;
    DynamicValue::Reader::~Reader(&local_1b0);
  }
  name_09.content.size_ = 0xb;
  name_09.content.ptr = "int64Field";
  DynamicStruct::Reader::get(&local_1b0,&reader,name_09);
  _kjCondition._8_8_ = DynamicValue::Reader::AsImpl<long,_(capnp::Kind)0>::apply(&local_1b0);
  _kjCondition.left = (Void *)((ulong)_kjCondition.left & 0xffffffff00000000);
  _kjCondition.op.content.size_ = 5;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.result = _kjCondition._8_8_ == 0;
  DynamicValue::Reader::~Reader(&local_1b0);
  if ((_kjCondition.result == false) && (kj::_::Debug::minSeverity < 3)) {
    auVar5._12_4_ = 0;
    auVar5._0_12_ = stack0xffffffffffffff1c;
    __kjCondition_10 = (ArrayPtr<const_unsigned_char>)(auVar5 << 0x20);
    name_10.content.size_ = 0xb;
    name_10.content.ptr = "int64Field";
    DynamicStruct::Reader::get(&local_1b0,&reader,name_10);
    SVar62.super_Schema.raw =
         (Schema)DynamicValue::Reader::AsImpl<long,_(capnp::Kind)0>::apply(&local_1b0);
    subReader.schema.super_Schema.raw = SVar62.super_Schema.raw;
    kj::_::Debug::log<char_const(&)[74],kj::_::DebugComparison<int,long>&,int,long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x216,ERROR,
               "\"failed: expected \" \"(0) == (reader.get(\\\"int64Field\\\").template as<int64_t>())\", _kjCondition, 0, reader.get(\"int64Field\").template as<int64_t>()"
               ,(char (*) [74])
                "failed: expected (0) == (reader.get(\"int64Field\").template as<int64_t>())",
               (DebugComparison<int,_long> *)&_kjCondition,(int *)&_kjCondition_10,
               (long *)&subReader);
    DynamicValue::Reader::~Reader(&local_1b0);
  }
  name_11.content.size_ = 0xb;
  name_11.content.ptr = "uInt8Field";
  DynamicStruct::Reader::get(&local_1b0,&reader,name_11);
  uVar55 = DynamicValue::Reader::AsImpl<unsigned_char,_(capnp::Kind)0>::apply(&local_1b0);
  _kjCondition.left = (Void *)((ulong)CONCAT31(_kjCondition.left._5_3_,uVar55) << 0x20);
  _kjCondition._8_8_ = anon_var_dwarf_a9f8;
  _kjCondition.op.content.size_._0_1_ = uVar55 == '\0';
  _kjCondition.op.content.ptr = &DAT_00000005;
  DynamicValue::Reader::~Reader(&local_1b0);
  if (((char)_kjCondition.op.content.size_ == '\0') && (kj::_::Debug::minSeverity < 3)) {
    auVar6._12_4_ = 0;
    auVar6._0_12_ = (undefined1  [12])subReader._4_12_;
    subReader._0_16_ = auVar6 << 0x20;
    name_12.content.size_ = 0xb;
    name_12.content.ptr = "uInt8Field";
    DynamicStruct::Reader::get(&local_1b0,&reader,name_12);
    uVar55 = DynamicValue::Reader::AsImpl<unsigned_char,_(capnp::Kind)0>::apply(&local_1b0);
    _kjCondition_10.value = (bool)uVar55;
    kj::_::Debug::
    log<char_const(&)[75],kj::_::DebugComparison<unsigned_int,unsigned_char>&,unsigned_int,unsigned_char>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x217,ERROR,
               "\"failed: expected \" \"(0u) == (reader.get(\\\"uInt8Field\\\").template as<uint8_t>())\", _kjCondition, 0u, reader.get(\"uInt8Field\").template as<uint8_t>()"
               ,(char (*) [75])
                "failed: expected (0u) == (reader.get(\"uInt8Field\").template as<uint8_t>())",
               (DebugComparison<unsigned_int,_unsigned_char> *)&_kjCondition,(uint *)&subReader,
               &_kjCondition_10.value);
    DynamicValue::Reader::~Reader(&local_1b0);
  }
  name_13.content.size_ = 0xc;
  name_13.content.ptr = "uInt16Field";
  DynamicStruct::Reader::get(&local_1b0,&reader,name_13);
  uVar58 = DynamicValue::Reader::AsImpl<unsigned_short,_(capnp::Kind)0>::apply(&local_1b0);
  _kjCondition.left = (Void *)((ulong)CONCAT22(_kjCondition.left._6_2_,uVar58) << 0x20);
  _kjCondition._8_8_ = anon_var_dwarf_a9f8;
  _kjCondition.op.content.size_._0_1_ = uVar58 == 0;
  _kjCondition.op.content.ptr = &DAT_00000005;
  DynamicValue::Reader::~Reader(&local_1b0);
  if (((char)_kjCondition.op.content.size_ == '\0') && (kj::_::Debug::minSeverity < 3)) {
    auVar7._12_4_ = 0;
    auVar7._0_12_ = (undefined1  [12])subReader._4_12_;
    subReader._0_16_ = auVar7 << 0x20;
    name_14.content.size_ = 0xc;
    name_14.content.ptr = "uInt16Field";
    DynamicStruct::Reader::get(&local_1b0,&reader,name_14);
    uVar58 = DynamicValue::Reader::AsImpl<unsigned_short,_(capnp::Kind)0>::apply(&local_1b0);
    __kjCondition_10 = uVar58;
    kj::_::Debug::
    log<char_const(&)[77],kj::_::DebugComparison<unsigned_int,unsigned_short>&,unsigned_int,unsigned_short>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x218,ERROR,
               "\"failed: expected \" \"(0u) == (reader.get(\\\"uInt16Field\\\").template as<uint16_t>())\", _kjCondition, 0u, reader.get(\"uInt16Field\").template as<uint16_t>()"
               ,(char (*) [77])
                "failed: expected (0u) == (reader.get(\"uInt16Field\").template as<uint16_t>())",
               (DebugComparison<unsigned_int,_unsigned_short> *)&_kjCondition,(uint *)&subReader,
               (unsigned_short *)&_kjCondition_10);
    DynamicValue::Reader::~Reader(&local_1b0);
  }
  name_15.content.size_ = 0xc;
  name_15.content.ptr = "uInt32Field";
  DynamicStruct::Reader::get(&local_1b0,&reader,name_15);
  uVar61 = DynamicValue::Reader::AsImpl<unsigned_int,_(capnp::Kind)0>::apply(&local_1b0);
  _kjCondition.left = (Void *)((ulong)uVar61 << 0x20);
  _kjCondition._8_8_ = anon_var_dwarf_a9f8;
  _kjCondition.op.content.size_._0_1_ = uVar61 == 0;
  _kjCondition.op.content.ptr = &DAT_00000005;
  DynamicValue::Reader::~Reader(&local_1b0);
  if (((char)_kjCondition.op.content.size_ == '\0') && (kj::_::Debug::minSeverity < 3)) {
    auVar8._12_4_ = 0;
    auVar8._0_12_ = (undefined1  [12])subReader._4_12_;
    subReader._0_16_ = auVar8 << 0x20;
    name_16.content.size_ = 0xc;
    name_16.content.ptr = "uInt32Field";
    DynamicStruct::Reader::get(&local_1b0,&reader,name_16);
    uVar61 = DynamicValue::Reader::AsImpl<unsigned_int,_(capnp::Kind)0>::apply(&local_1b0);
    __kjCondition_10 = uVar61;
    kj::_::Debug::
    log<char_const(&)[77],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x219,ERROR,
               "\"failed: expected \" \"(0u) == (reader.get(\\\"uInt32Field\\\").template as<uint32_t>())\", _kjCondition, 0u, reader.get(\"uInt32Field\").template as<uint32_t>()"
               ,(char (*) [77])
                "failed: expected (0u) == (reader.get(\"uInt32Field\").template as<uint32_t>())",
               (DebugComparison<unsigned_int,_unsigned_int> *)&_kjCondition,(uint *)&subReader,
               (uint *)&_kjCondition_10);
    DynamicValue::Reader::~Reader(&local_1b0);
  }
  name_17.content.size_ = 0xc;
  name_17.content.ptr = "uInt64Field";
  DynamicStruct::Reader::get(&local_1b0,&reader,name_17);
  _kjCondition._8_8_ =
       DynamicValue::Reader::AsImpl<unsigned_long,_(capnp::Kind)0>::apply(&local_1b0);
  _kjCondition.left = (Void *)((ulong)_kjCondition.left & 0xffffffff00000000);
  _kjCondition.op.content.size_ = 5;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.result = _kjCondition._8_8_ == 0;
  DynamicValue::Reader::~Reader(&local_1b0);
  if ((_kjCondition.result == false) && (kj::_::Debug::minSeverity < 3)) {
    auVar9._12_4_ = 0;
    auVar9._0_12_ = stack0xffffffffffffff1c;
    __kjCondition_10 = (ArrayPtr<const_unsigned_char>)(auVar9 << 0x20);
    name_18.content.size_ = 0xc;
    name_18.content.ptr = "uInt64Field";
    DynamicStruct::Reader::get(&local_1b0,&reader,name_18);
    SVar62.super_Schema.raw =
         (Schema)DynamicValue::Reader::AsImpl<unsigned_long,_(capnp::Kind)0>::apply(&local_1b0);
    subReader.schema.super_Schema.raw = SVar62.super_Schema.raw;
    kj::_::Debug::
    log<char_const(&)[77],kj::_::DebugComparison<unsigned_int,unsigned_long>&,unsigned_int,unsigned_long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x21a,ERROR,
               "\"failed: expected \" \"(0u) == (reader.get(\\\"uInt64Field\\\").template as<uint64_t>())\", _kjCondition, 0u, reader.get(\"uInt64Field\").template as<uint64_t>()"
               ,(char (*) [77])
                "failed: expected (0u) == (reader.get(\"uInt64Field\").template as<uint64_t>())",
               (DebugComparison<unsigned_int,_unsigned_long> *)&_kjCondition,
               (uint *)&_kjCondition_10,(unsigned_long *)&subReader);
    DynamicValue::Reader::~Reader(&local_1b0);
  }
  name_19.content.size_ = 0xd;
  name_19.content.ptr = "float32Field";
  DynamicStruct::Reader::get(&local_1b0,&reader,name_19);
  fVar65 = DynamicValue::Reader::AsImpl<float,_(capnp::Kind)0>::apply(&local_1b0);
  bVar56 = true;
  if ((fVar65 != 0.0) || (NAN(fVar65))) {
    fVar67 = -fVar65;
    if (-fVar65 <= fVar65) {
      fVar67 = fVar65;
    }
    bVar56 = fVar67 < fVar67 * 1e-05;
  }
  _kjCondition_10.value = bVar56;
  DynamicValue::Reader::~Reader(&local_1b0);
  if ((_kjCondition_10.value == false) && (kj::_::Debug::minSeverity < 3)) {
    name_20.content.size_ = 0xd;
    name_20.content.ptr = "float32Field";
    DynamicStruct::Reader::get(&local_1b0,&reader,name_20);
    fVar65 = DynamicValue::Reader::AsImpl<float,_(capnp::Kind)0>::apply(&local_1b0);
    _kjCondition.left = (Void *)CONCAT44(_kjCondition.left._4_4_,fVar65);
    auVar10._12_4_ = 0;
    auVar10._0_12_ = (undefined1  [12])subReader._4_12_;
    subReader._0_16_ = auVar10 << 0x20;
    kj::_::Debug::log<char_const(&)[95],kj::_::DebugExpression<bool>&,float,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x21b,ERROR,
               "\"failed: expected \" \"::kj::_::floatAlmostEqual(reader.get(\\\"float32Field\\\").template as<float>(), 0)\", _kjCondition, reader.get(\"float32Field\").template as<float>(), 0"
               ,(char (*) [95])
                "failed: expected ::kj::_::floatAlmostEqual(reader.get(\"float32Field\").template as<float>(), 0)"
               ,&_kjCondition_10,(float *)&_kjCondition,(int *)&subReader);
    DynamicValue::Reader::~Reader(&local_1b0);
  }
  name_21.content.size_ = 0xd;
  name_21.content.ptr = "float64Field";
  DynamicStruct::Reader::get(&local_1b0,&reader,name_21);
  dVar66 = DynamicValue::Reader::AsImpl<double,_(capnp::Kind)0>::apply(&local_1b0);
  bVar56 = true;
  if ((dVar66 != 0.0) || (NAN(dVar66))) {
    dVar68 = -dVar66;
    if (-dVar66 <= dVar66) {
      dVar68 = dVar66;
    }
    bVar56 = dVar68 < dVar68 * 1e-12;
  }
  _kjCondition_10.value = bVar56;
  DynamicValue::Reader::~Reader(&local_1b0);
  if ((_kjCondition_10.value == false) && (kj::_::Debug::minSeverity < 3)) {
    name_22.content.size_ = 0xd;
    name_22.content.ptr = "float64Field";
    DynamicStruct::Reader::get(&local_1b0,&reader,name_22);
    _kjCondition.left =
         (Void *)DynamicValue::Reader::AsImpl<double,_(capnp::Kind)0>::apply(&local_1b0);
    auVar11._12_4_ = 0;
    auVar11._0_12_ = (undefined1  [12])subReader._4_12_;
    subReader._0_16_ = auVar11 << 0x20;
    kj::_::Debug::log<char_const(&)[97],kj::_::DebugExpression<bool>&,double,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x21c,ERROR,
               "\"failed: expected \" \"::kj::_::doubleAlmostEqual(reader.get(\\\"float64Field\\\").template as<double>(), 0)\", _kjCondition, reader.get(\"float64Field\").template as<double>(), 0"
               ,(char (*) [97])
                "failed: expected ::kj::_::doubleAlmostEqual(reader.get(\"float64Field\").template as<double>(), 0)"
               ,&_kjCondition_10,(double *)&_kjCondition,(int *)&subReader);
    DynamicValue::Reader::~Reader(&local_1b0);
  }
  __kjCondition_10 = "";
  name_23.content.size_ = 10;
  name_23.content.ptr = "textField";
  DynamicStruct::Reader::get(&local_1b0,&reader,name_23);
  subReader._0_16_ = DynamicValue::Reader::AsImpl<capnp::Text,_(capnp::Kind)1>::apply(&local_1b0);
  kj::_::DebugExpression<char_const(&)[1]>::operator==
            ((DebugComparison<const_char_(&)[1],_capnp::Text::Reader> *)&_kjCondition,
             (DebugExpression<char_const(&)[1]> *)&_kjCondition_10,(Reader *)&subReader);
  DynamicValue::Reader::~Reader(&local_1b0);
  if (((bool)local_140 == false) && (kj::_::Debug::minSeverity < 3)) {
    name_24.content.size_ = 10;
    name_24.content.ptr = "textField";
    DynamicStruct::Reader::get(&local_1b0,&reader,name_24);
    subReader._0_16_ = DynamicValue::Reader::AsImpl<capnp::Text,_(capnp::Kind)1>::apply(&local_1b0);
    kj::_::Debug::
    log<char_const(&)[71],kj::_::DebugComparison<char_const(&)[1],capnp::Text::Reader>&,char_const(&)[1],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x21d,ERROR,
               "\"failed: expected \" \"(\\\"\\\") == (reader.get(\\\"textField\\\").template as<Text>())\", _kjCondition, \"\", reader.get(\"textField\").template as<Text>()"
               ,(char (*) [71])
                "failed: expected (\"\") == (reader.get(\"textField\").template as<Text>())",
               (DebugComparison<const_char_(&)[1],_capnp::Text::Reader> *)&_kjCondition,
               (char (*) [1])0x308a6f,(Reader *)&subReader);
    DynamicValue::Reader::~Reader(&local_1b0);
  }
  name_25.content.size_ = 10;
  name_25.content.ptr = "dataField";
  DynamicStruct::Reader::get(&local_1b0,&reader,name_25);
  _kjCondition.op.content =
       (ArrayPtr<const_char>)
       DynamicValue::Reader::AsImpl<capnp::Data,_(capnp::Kind)1>::apply(&local_1b0);
  sVar64 = _kjCondition.op.content.size_;
  _kjCondition.left = (Void *)0x308a6f;
  _kjCondition._8_8_ = 0;
  _kjCondition._32_8_ = anon_var_dwarf_a9f8;
  DynamicValue::Reader::~Reader(&local_1b0);
  if ((sVar64 != 0) && (kj::_::Debug::minSeverity < 3)) {
    subReader._0_16_ = ZEXT816(0x308a6f);
    name_26.content.size_ = 10;
    name_26.content.ptr = "dataField";
    DynamicStruct::Reader::get(&local_1b0,&reader,name_26);
    __kjCondition_10 =
         (ArrayPtr<const_unsigned_char>)
         DynamicValue::Reader::AsImpl<capnp::Data,_(capnp::Kind)1>::apply(&local_1b0);
    kj::_::Debug::
    log<char_const(&)[77],kj::_::DebugComparison<capnp::Data::Reader,capnp::Data::Reader>&,capnp::Data::Reader,capnp::Data::Reader>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x21e,ERROR,
               "\"failed: expected \" \"(data(\\\"\\\")) == (reader.get(\\\"dataField\\\").template as<Data>())\", _kjCondition, data(\"\"), reader.get(\"dataField\").template as<Data>()"
               ,(char (*) [77])
                "failed: expected (data(\"\")) == (reader.get(\"dataField\").template as<Data>())",
               (DebugComparison<capnp::Data::Reader,_capnp::Data::Reader> *)&_kjCondition,
               (Reader *)&subReader,(Reader *)&_kjCondition_10);
    DynamicValue::Reader::~Reader(&local_1b0);
  }
  name_27.content.size_ = 0xc;
  name_27.content.ptr = "structField";
  DynamicStruct::Reader::get(&local_1b0,&reader,name_27);
  DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply(&subReader,&local_1b0);
  DynamicValue::Reader::~Reader(&local_1b0);
  name_28.content.size_ = 10;
  name_28.content.ptr = "voidField";
  DynamicStruct::Reader::get(&local_1b0,&subReader,name_28);
  DynamicValue::Reader::AsImpl<capnp::Void,_(capnp::Kind)0>::apply(&local_1b0);
  _kjCondition.left = (Void *)&VOID;
  _kjCondition.op.content.size_ = 5;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.result = true;
  DynamicValue::Reader::~Reader(&local_1b0);
  if ((_kjCondition.result == false) && (kj::_::Debug::minSeverity < 3)) {
    name_29.content.size_ = 10;
    name_29.content.ptr = "voidField";
    DynamicStruct::Reader::get(&local_1b0,&subReader,name_29);
    DynamicValue::Reader::AsImpl<capnp::Void,_(capnp::Kind)0>::apply(&local_1b0);
    kj::_::Debug::
    log<char_const(&)[76],kj::_::DebugComparison<capnp::Void_const&,capnp::Void>&,capnp::Void_const&,capnp::Void>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x221,ERROR,
               "\"failed: expected \" \"(VOID) == (subReader.get(\\\"voidField\\\").template as<Void>())\", _kjCondition, VOID, subReader.get(\"voidField\").template as<Void>()"
               ,(char (*) [76])
                "failed: expected (VOID) == (subReader.get(\"voidField\").template as<Void>())",
               &_kjCondition,(Void *)&VOID,(Void *)&_kjCondition_10);
    DynamicValue::Reader::~Reader(&local_1b0);
  }
  name_30.content.size_ = 10;
  name_30.content.ptr = "boolField";
  DynamicStruct::Reader::get(&local_1b0,&subReader,name_30);
  RVar53 = DynamicValue::Reader::AsImpl<bool,_(capnp::Kind)0>::apply(&local_1b0);
  _kjCondition.left = (Void *)((ulong)CONCAT61(_kjCondition.left._2_6_,RVar53) << 8);
  _kjCondition._8_8_ = anon_var_dwarf_a9f8;
  _kjCondition.op.content.size_._0_1_ = !RVar53;
  _kjCondition.op.content.ptr = &DAT_00000005;
  DynamicValue::Reader::~Reader(&local_1b0);
  if (((char)_kjCondition.op.content.size_ == '\0') && (kj::_::Debug::minSeverity < 3)) {
    auVar12[0xf] = 0;
    auVar12._0_15_ = _auStack_e7;
    __kjCondition_10 = (ArrayPtr<const_unsigned_char>)(auVar12 << 8);
    name_31.content.size_ = 10;
    name_31.content.ptr = "boolField";
    DynamicStruct::Reader::get(&local_1b0,&subReader,name_31);
    _kjCondition_23.value = DynamicValue::Reader::AsImpl<bool,_(capnp::Kind)0>::apply(&local_1b0);
    kj::_::Debug::log<char_const(&)[77],kj::_::DebugComparison<bool,bool>&,bool,bool>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x222,ERROR,
               "\"failed: expected \" \"(false) == (subReader.get(\\\"boolField\\\").template as<bool>())\", _kjCondition, false, subReader.get(\"boolField\").template as<bool>()"
               ,(char (*) [77])
                "failed: expected (false) == (subReader.get(\"boolField\").template as<bool>())",
               (DebugComparison<bool,_bool> *)&_kjCondition,(bool *)&_kjCondition_10,
               &_kjCondition_23.value);
    DynamicValue::Reader::~Reader(&local_1b0);
  }
  name_32.content.size_ = 10;
  name_32.content.ptr = "int8Field";
  DynamicStruct::Reader::get(&local_1b0,&subReader,name_32);
  iVar54 = DynamicValue::Reader::AsImpl<signed_char,_(capnp::Kind)0>::apply(&local_1b0);
  _kjCondition.left = (Void *)((ulong)CONCAT31(_kjCondition.left._5_3_,iVar54) << 0x20);
  _kjCondition._8_8_ = anon_var_dwarf_a9f8;
  _kjCondition.op.content.size_._0_1_ = iVar54 == '\0';
  _kjCondition.op.content.ptr = &DAT_00000005;
  DynamicValue::Reader::~Reader(&local_1b0);
  if (((char)_kjCondition.op.content.size_ == '\0') && (kj::_::Debug::minSeverity < 3)) {
    auVar13._12_4_ = 0;
    auVar13._0_12_ = stack0xffffffffffffff1c;
    __kjCondition_10 = (ArrayPtr<const_unsigned_char>)(auVar13 << 0x20);
    name_33.content.size_ = 10;
    name_33.content.ptr = "int8Field";
    DynamicStruct::Reader::get(&local_1b0,&subReader,name_33);
    iVar54 = DynamicValue::Reader::AsImpl<signed_char,_(capnp::Kind)0>::apply(&local_1b0);
    _kjCondition_23.value = (bool)iVar54;
    kj::_::Debug::log<char_const(&)[75],kj::_::DebugComparison<int,signed_char>&,int,signed_char>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x223,ERROR,
               "\"failed: expected \" \"(0) == (subReader.get(\\\"int8Field\\\").template as<int8_t>())\", _kjCondition, 0, subReader.get(\"int8Field\").template as<int8_t>()"
               ,(char (*) [75])
                "failed: expected (0) == (subReader.get(\"int8Field\").template as<int8_t>())",
               (DebugComparison<int,_signed_char> *)&_kjCondition,(int *)&_kjCondition_10,
               &_kjCondition_23.value);
    DynamicValue::Reader::~Reader(&local_1b0);
  }
  name_34.content.size_ = 0xb;
  name_34.content.ptr = "int16Field";
  DynamicStruct::Reader::get(&local_1b0,&subReader,name_34);
  iVar57 = DynamicValue::Reader::AsImpl<short,_(capnp::Kind)0>::apply(&local_1b0);
  _kjCondition.left = (Void *)((ulong)CONCAT22(_kjCondition.left._6_2_,iVar57) << 0x20);
  _kjCondition._8_8_ = anon_var_dwarf_a9f8;
  _kjCondition.op.content.size_._0_1_ = iVar57 == 0;
  _kjCondition.op.content.ptr = &DAT_00000005;
  DynamicValue::Reader::~Reader(&local_1b0);
  if (((char)_kjCondition.op.content.size_ == '\0') && (kj::_::Debug::minSeverity < 3)) {
    auVar14._12_4_ = 0;
    auVar14._0_12_ = stack0xffffffffffffff1c;
    __kjCondition_10 = (ArrayPtr<const_unsigned_char>)(auVar14 << 0x20);
    name_35.content.size_ = 0xb;
    name_35.content.ptr = "int16Field";
    DynamicStruct::Reader::get(&local_1b0,&subReader,name_35);
    iVar57 = DynamicValue::Reader::AsImpl<short,_(capnp::Kind)0>::apply(&local_1b0);
    __kjCondition_23 = iVar57;
    kj::_::Debug::log<char_const(&)[77],kj::_::DebugComparison<int,short>&,int,short>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x224,ERROR,
               "\"failed: expected \" \"(0) == (subReader.get(\\\"int16Field\\\").template as<int16_t>())\", _kjCondition, 0, subReader.get(\"int16Field\").template as<int16_t>()"
               ,(char (*) [77])
                "failed: expected (0) == (subReader.get(\"int16Field\").template as<int16_t>())",
               (DebugComparison<int,_short> *)&_kjCondition,(int *)&_kjCondition_10,
               (short *)&_kjCondition_23);
    DynamicValue::Reader::~Reader(&local_1b0);
  }
  name_36.content.size_ = 0xb;
  name_36.content.ptr = "int32Field";
  DynamicStruct::Reader::get(&local_1b0,&subReader,name_36);
  uVar59 = DynamicValue::Reader::AsImpl<int,_(capnp::Kind)0>::apply(&local_1b0);
  _kjCondition.left = (Void *)((ulong)uVar59 << 0x20);
  _kjCondition._8_8_ = anon_var_dwarf_a9f8;
  _kjCondition.op.content.size_._0_1_ = uVar59 == 0;
  _kjCondition.op.content.ptr = &DAT_00000005;
  DynamicValue::Reader::~Reader(&local_1b0);
  if (((char)_kjCondition.op.content.size_ == '\0') && (kj::_::Debug::minSeverity < 3)) {
    auVar15._12_4_ = 0;
    auVar15._0_12_ = stack0xffffffffffffff1c;
    __kjCondition_10 = (ArrayPtr<const_unsigned_char>)(auVar15 << 0x20);
    name_37.content.size_ = 0xb;
    name_37.content.ptr = "int32Field";
    DynamicStruct::Reader::get(&local_1b0,&subReader,name_37);
    iVar60 = DynamicValue::Reader::AsImpl<int,_(capnp::Kind)0>::apply(&local_1b0);
    __kjCondition_23 = iVar60;
    kj::_::Debug::log<char_const(&)[77],kj::_::DebugComparison<int,int>&,int,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x225,ERROR,
               "\"failed: expected \" \"(0) == (subReader.get(\\\"int32Field\\\").template as<int32_t>())\", _kjCondition, 0, subReader.get(\"int32Field\").template as<int32_t>()"
               ,(char (*) [77])
                "failed: expected (0) == (subReader.get(\"int32Field\").template as<int32_t>())",
               (DebugComparison<int,_int> *)&_kjCondition,(int *)&_kjCondition_10,
               (int *)&_kjCondition_23);
    DynamicValue::Reader::~Reader(&local_1b0);
  }
  name_38.content.size_ = 0xb;
  name_38.content.ptr = "int64Field";
  DynamicStruct::Reader::get(&local_1b0,&subReader,name_38);
  _kjCondition._8_8_ = DynamicValue::Reader::AsImpl<long,_(capnp::Kind)0>::apply(&local_1b0);
  _kjCondition.left = (Void *)((ulong)_kjCondition.left & 0xffffffff00000000);
  _kjCondition.op.content.size_ = 5;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.result = _kjCondition._8_8_ == 0;
  DynamicValue::Reader::~Reader(&local_1b0);
  if ((_kjCondition.result == false) && (kj::_::Debug::minSeverity < 3)) {
    auVar16._12_4_ = 0;
    auVar16._0_12_ = auStack_ac;
    __kjCondition_23 = (ArrayPtr<const_unsigned_char>)(auVar16 << 0x20);
    name_39.content.size_ = 0xb;
    name_39.content.ptr = "int64Field";
    DynamicStruct::Reader::get(&local_1b0,&subReader,name_39);
    puVar63 = (uchar *)DynamicValue::Reader::AsImpl<long,_(capnp::Kind)0>::apply(&local_1b0);
    __kjCondition_10 = puVar63;
    kj::_::Debug::log<char_const(&)[77],kj::_::DebugComparison<int,long>&,int,long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x226,ERROR,
               "\"failed: expected \" \"(0) == (subReader.get(\\\"int64Field\\\").template as<int64_t>())\", _kjCondition, 0, subReader.get(\"int64Field\").template as<int64_t>()"
               ,(char (*) [77])
                "failed: expected (0) == (subReader.get(\"int64Field\").template as<int64_t>())",
               (DebugComparison<int,_long> *)&_kjCondition,(int *)&_kjCondition_23,
               (long *)&_kjCondition_10);
    DynamicValue::Reader::~Reader(&local_1b0);
  }
  name_40.content.size_ = 0xb;
  name_40.content.ptr = "uInt8Field";
  DynamicStruct::Reader::get(&local_1b0,&subReader,name_40);
  uVar55 = DynamicValue::Reader::AsImpl<unsigned_char,_(capnp::Kind)0>::apply(&local_1b0);
  _kjCondition.left = (Void *)((ulong)CONCAT31(_kjCondition.left._5_3_,uVar55) << 0x20);
  _kjCondition._8_8_ = anon_var_dwarf_a9f8;
  _kjCondition.op.content.size_._0_1_ = uVar55 == '\0';
  _kjCondition.op.content.ptr = &DAT_00000005;
  DynamicValue::Reader::~Reader(&local_1b0);
  if (((char)_kjCondition.op.content.size_ == '\0') && (kj::_::Debug::minSeverity < 3)) {
    auVar17._12_4_ = 0;
    auVar17._0_12_ = stack0xffffffffffffff1c;
    __kjCondition_10 = (ArrayPtr<const_unsigned_char>)(auVar17 << 0x20);
    name_41.content.size_ = 0xb;
    name_41.content.ptr = "uInt8Field";
    DynamicStruct::Reader::get(&local_1b0,&subReader,name_41);
    uVar55 = DynamicValue::Reader::AsImpl<unsigned_char,_(capnp::Kind)0>::apply(&local_1b0);
    _kjCondition_23.value = (bool)uVar55;
    kj::_::Debug::
    log<char_const(&)[78],kj::_::DebugComparison<unsigned_int,unsigned_char>&,unsigned_int,unsigned_char>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x227,ERROR,
               "\"failed: expected \" \"(0u) == (subReader.get(\\\"uInt8Field\\\").template as<uint8_t>())\", _kjCondition, 0u, subReader.get(\"uInt8Field\").template as<uint8_t>()"
               ,(char (*) [78])
                "failed: expected (0u) == (subReader.get(\"uInt8Field\").template as<uint8_t>())",
               (DebugComparison<unsigned_int,_unsigned_char> *)&_kjCondition,
               (uint *)&_kjCondition_10,&_kjCondition_23.value);
    DynamicValue::Reader::~Reader(&local_1b0);
  }
  name_42.content.size_ = 0xc;
  name_42.content.ptr = "uInt16Field";
  DynamicStruct::Reader::get(&local_1b0,&subReader,name_42);
  uVar58 = DynamicValue::Reader::AsImpl<unsigned_short,_(capnp::Kind)0>::apply(&local_1b0);
  _kjCondition.left = (Void *)((ulong)CONCAT22(_kjCondition.left._6_2_,uVar58) << 0x20);
  _kjCondition._8_8_ = anon_var_dwarf_a9f8;
  _kjCondition.op.content.size_._0_1_ = uVar58 == 0;
  _kjCondition.op.content.ptr = &DAT_00000005;
  DynamicValue::Reader::~Reader(&local_1b0);
  if (((char)_kjCondition.op.content.size_ == '\0') && (kj::_::Debug::minSeverity < 3)) {
    auVar18._12_4_ = 0;
    auVar18._0_12_ = stack0xffffffffffffff1c;
    __kjCondition_10 = (ArrayPtr<const_unsigned_char>)(auVar18 << 0x20);
    name_43.content.size_ = 0xc;
    name_43.content.ptr = "uInt16Field";
    DynamicStruct::Reader::get(&local_1b0,&subReader,name_43);
    uVar58 = DynamicValue::Reader::AsImpl<unsigned_short,_(capnp::Kind)0>::apply(&local_1b0);
    __kjCondition_23 = uVar58;
    kj::_::Debug::
    log<char_const(&)[80],kj::_::DebugComparison<unsigned_int,unsigned_short>&,unsigned_int,unsigned_short>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x228,ERROR,
               "\"failed: expected \" \"(0u) == (subReader.get(\\\"uInt16Field\\\").template as<uint16_t>())\", _kjCondition, 0u, subReader.get(\"uInt16Field\").template as<uint16_t>()"
               ,(char (*) [80])
                "failed: expected (0u) == (subReader.get(\"uInt16Field\").template as<uint16_t>())",
               (DebugComparison<unsigned_int,_unsigned_short> *)&_kjCondition,
               (uint *)&_kjCondition_10,(unsigned_short *)&_kjCondition_23);
    DynamicValue::Reader::~Reader(&local_1b0);
  }
  name_44.content.size_ = 0xc;
  name_44.content.ptr = "uInt32Field";
  DynamicStruct::Reader::get(&local_1b0,&subReader,name_44);
  uVar61 = DynamicValue::Reader::AsImpl<unsigned_int,_(capnp::Kind)0>::apply(&local_1b0);
  _kjCondition.left = (Void *)((ulong)uVar61 << 0x20);
  _kjCondition._8_8_ = anon_var_dwarf_a9f8;
  _kjCondition.op.content.size_._0_1_ = uVar61 == 0;
  _kjCondition.op.content.ptr = &DAT_00000005;
  DynamicValue::Reader::~Reader(&local_1b0);
  if (((char)_kjCondition.op.content.size_ == '\0') && (kj::_::Debug::minSeverity < 3)) {
    auVar19._12_4_ = 0;
    auVar19._0_12_ = stack0xffffffffffffff1c;
    __kjCondition_10 = (ArrayPtr<const_unsigned_char>)(auVar19 << 0x20);
    name_45.content.size_ = 0xc;
    name_45.content.ptr = "uInt32Field";
    DynamicStruct::Reader::get(&local_1b0,&subReader,name_45);
    uVar61 = DynamicValue::Reader::AsImpl<unsigned_int,_(capnp::Kind)0>::apply(&local_1b0);
    __kjCondition_23 = uVar61;
    kj::_::Debug::
    log<char_const(&)[80],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x229,ERROR,
               "\"failed: expected \" \"(0u) == (subReader.get(\\\"uInt32Field\\\").template as<uint32_t>())\", _kjCondition, 0u, subReader.get(\"uInt32Field\").template as<uint32_t>()"
               ,(char (*) [80])
                "failed: expected (0u) == (subReader.get(\"uInt32Field\").template as<uint32_t>())",
               (DebugComparison<unsigned_int,_unsigned_int> *)&_kjCondition,(uint *)&_kjCondition_10
               ,(uint *)&_kjCondition_23);
    DynamicValue::Reader::~Reader(&local_1b0);
  }
  name_46.content.size_ = 0xc;
  name_46.content.ptr = "uInt64Field";
  DynamicStruct::Reader::get(&local_1b0,&subReader,name_46);
  _kjCondition._8_8_ =
       DynamicValue::Reader::AsImpl<unsigned_long,_(capnp::Kind)0>::apply(&local_1b0);
  _kjCondition.left = (Void *)((ulong)_kjCondition.left & 0xffffffff00000000);
  _kjCondition.op.content.size_ = 5;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.result = _kjCondition._8_8_ == 0;
  DynamicValue::Reader::~Reader(&local_1b0);
  if ((_kjCondition.result == false) && (kj::_::Debug::minSeverity < 3)) {
    auVar20._12_4_ = 0;
    auVar20._0_12_ = auStack_ac;
    __kjCondition_23 = (ArrayPtr<const_unsigned_char>)(auVar20 << 0x20);
    name_47.content.size_ = 0xc;
    name_47.content.ptr = "uInt64Field";
    DynamicStruct::Reader::get(&local_1b0,&subReader,name_47);
    puVar63 = (uchar *)DynamicValue::Reader::AsImpl<unsigned_long,_(capnp::Kind)0>::apply
                                 (&local_1b0);
    __kjCondition_10 = puVar63;
    kj::_::Debug::
    log<char_const(&)[80],kj::_::DebugComparison<unsigned_int,unsigned_long>&,unsigned_int,unsigned_long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x22a,ERROR,
               "\"failed: expected \" \"(0u) == (subReader.get(\\\"uInt64Field\\\").template as<uint64_t>())\", _kjCondition, 0u, subReader.get(\"uInt64Field\").template as<uint64_t>()"
               ,(char (*) [80])
                "failed: expected (0u) == (subReader.get(\"uInt64Field\").template as<uint64_t>())",
               (DebugComparison<unsigned_int,_unsigned_long> *)&_kjCondition,
               (uint *)&_kjCondition_23,(unsigned_long *)&_kjCondition_10);
    DynamicValue::Reader::~Reader(&local_1b0);
  }
  name_48.content.size_ = 0xd;
  name_48.content.ptr = "float32Field";
  DynamicStruct::Reader::get(&local_1b0,&subReader,name_48);
  fVar65 = DynamicValue::Reader::AsImpl<float,_(capnp::Kind)0>::apply(&local_1b0);
  bVar56 = true;
  if ((fVar65 != 0.0) || (NAN(fVar65))) {
    fVar67 = -fVar65;
    if (-fVar65 <= fVar65) {
      fVar67 = fVar65;
    }
    bVar56 = fVar67 < fVar67 * 1e-05;
  }
  _kjCondition_23.value = bVar56;
  DynamicValue::Reader::~Reader(&local_1b0);
  if ((_kjCondition_23.value == false) && (kj::_::Debug::minSeverity < 3)) {
    name_49.content.size_ = 0xd;
    name_49.content.ptr = "float32Field";
    DynamicStruct::Reader::get(&local_1b0,&subReader,name_49);
    fVar65 = DynamicValue::Reader::AsImpl<float,_(capnp::Kind)0>::apply(&local_1b0);
    _kjCondition.left = (Void *)CONCAT44(_kjCondition.left._4_4_,fVar65);
    auVar21._12_4_ = 0;
    auVar21._0_12_ = stack0xffffffffffffff1c;
    __kjCondition_10 = (ArrayPtr<const_unsigned_char>)(auVar21 << 0x20);
    kj::_::Debug::log<char_const(&)[98],kj::_::DebugExpression<bool>&,float,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x22b,ERROR,
               "\"failed: expected \" \"::kj::_::floatAlmostEqual(subReader.get(\\\"float32Field\\\").template as<float>(), 0)\", _kjCondition, subReader.get(\"float32Field\").template as<float>(), 0"
               ,(char (*) [98])
                "failed: expected ::kj::_::floatAlmostEqual(subReader.get(\"float32Field\").template as<float>(), 0)"
               ,&_kjCondition_23,(float *)&_kjCondition,(int *)&_kjCondition_10);
    DynamicValue::Reader::~Reader(&local_1b0);
  }
  name_50.content.size_ = 0xd;
  name_50.content.ptr = "float64Field";
  DynamicStruct::Reader::get(&local_1b0,&subReader,name_50);
  dVar66 = DynamicValue::Reader::AsImpl<double,_(capnp::Kind)0>::apply(&local_1b0);
  bVar56 = true;
  if ((dVar66 != 0.0) || (NAN(dVar66))) {
    dVar68 = -dVar66;
    if (-dVar66 <= dVar66) {
      dVar68 = dVar66;
    }
    bVar56 = dVar68 < dVar68 * 1e-12;
  }
  _kjCondition_23.value = bVar56;
  DynamicValue::Reader::~Reader(&local_1b0);
  if ((_kjCondition_23.value == false) && (kj::_::Debug::minSeverity < 3)) {
    name_51.content.size_ = 0xd;
    name_51.content.ptr = "float64Field";
    DynamicStruct::Reader::get(&local_1b0,&subReader,name_51);
    _kjCondition.left =
         (Void *)DynamicValue::Reader::AsImpl<double,_(capnp::Kind)0>::apply(&local_1b0);
    auVar22._12_4_ = 0;
    auVar22._0_12_ = stack0xffffffffffffff1c;
    __kjCondition_10 = (ArrayPtr<const_unsigned_char>)(auVar22 << 0x20);
    kj::_::Debug::log<char_const(&)[100],kj::_::DebugExpression<bool>&,double,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x22c,ERROR,
               "\"failed: expected \" \"::kj::_::doubleAlmostEqual(subReader.get(\\\"float64Field\\\").template as<double>(), 0)\", _kjCondition, subReader.get(\"float64Field\").template as<double>(), 0"
               ,(char (*) [100])
                "failed: expected ::kj::_::doubleAlmostEqual(subReader.get(\"float64Field\").template as<double>(), 0)"
               ,&_kjCondition_23,(double *)&_kjCondition,(int *)&_kjCondition_10);
    DynamicValue::Reader::~Reader(&local_1b0);
  }
  __kjCondition_23 = "";
  name_52.content.size_ = 10;
  name_52.content.ptr = "textField";
  DynamicStruct::Reader::get(&local_1b0,&subReader,name_52);
  __kjCondition_10 =
       (ArrayPtr<const_unsigned_char>)
       DynamicValue::Reader::AsImpl<capnp::Text,_(capnp::Kind)1>::apply(&local_1b0);
  kj::_::DebugExpression<char_const(&)[1]>::operator==
            ((DebugComparison<const_char_(&)[1],_capnp::Text::Reader> *)&_kjCondition,
             (DebugExpression<char_const(&)[1]> *)&_kjCondition_23,(Reader *)&_kjCondition_10);
  DynamicValue::Reader::~Reader(&local_1b0);
  name_53.content.size_ = 10;
  name_53.content.ptr = "dataField";
  DynamicStruct::Reader::get(&local_1b0,&subReader,name_53);
  _kjCondition.op.content =
       (ArrayPtr<const_char>)
       DynamicValue::Reader::AsImpl<capnp::Data,_(capnp::Kind)1>::apply(&local_1b0);
  sVar64 = _kjCondition.op.content.size_;
  _kjCondition.left = (Void *)0x308a6f;
  _kjCondition._8_8_ = 0;
  _kjCondition._32_8_ = anon_var_dwarf_a9f8;
  DynamicValue::Reader::~Reader(&local_1b0);
  if ((sVar64 != 0) && (kj::_::Debug::minSeverity < 3)) {
    __kjCondition_10 = (ArrayPtr<const_unsigned_char>)ZEXT816(0x308a6f);
    name_54.content.size_ = 10;
    name_54.content.ptr = "dataField";
    DynamicStruct::Reader::get(&local_1b0,&subReader,name_54);
    __kjCondition_23 =
         (ArrayPtr<const_unsigned_char>)
         DynamicValue::Reader::AsImpl<capnp::Data,_(capnp::Kind)1>::apply(&local_1b0);
    kj::_::Debug::
    log<char_const(&)[80],kj::_::DebugComparison<capnp::Data::Reader,capnp::Data::Reader>&,capnp::Data::Reader,capnp::Data::Reader>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x22e,ERROR,
               "\"failed: expected \" \"(data(\\\"\\\")) == (subReader.get(\\\"dataField\\\").template as<Data>())\", _kjCondition, data(\"\"), subReader.get(\"dataField\").template as<Data>()"
               ,(char (*) [80])
                "failed: expected (data(\"\")) == (subReader.get(\"dataField\").template as<Data>())"
               ,(DebugComparison<capnp::Data::Reader,_capnp::Data::Reader> *)&_kjCondition,
               (Reader *)&_kjCondition_10,(Reader *)&_kjCondition_23);
    DynamicValue::Reader::~Reader(&local_1b0);
  }
  name_55.content.size_ = 0xc;
  name_55.content.ptr = "structField";
  DynamicStruct::Reader::get(&local_1b0,&subReader,name_55);
  DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
            ((ReaderFor<DynamicStruct> *)&_kjCondition_10,&local_1b0);
  DynamicValue::Reader::~Reader(&local_1b0);
  _kjCondition_27.left = (char (*) [1])0x308a6f;
  name_56.content.size_ = 10;
  name_56.content.ptr = "textField";
  DynamicStruct::Reader::get(&local_1b0,(Reader *)&_kjCondition_10,name_56);
  __kjCondition_23 =
       (ArrayPtr<const_unsigned_char>)
       DynamicValue::Reader::AsImpl<capnp::Text,_(capnp::Kind)1>::apply(&local_1b0);
  kj::_::DebugExpression<char_const(&)[1]>::operator==
            ((DebugComparison<const_char_(&)[1],_capnp::Text::Reader> *)&_kjCondition,
             (DebugExpression<char_const(&)[1]> *)&_kjCondition_27,(Reader *)&_kjCondition_23);
  DynamicValue::Reader::~Reader(&local_1b0);
  local_48 = "";
  name_57.content.size_ = 0xc;
  name_57.content.ptr = "structField";
  DynamicStruct::Reader::get((Reader *)&_kjCondition,(Reader *)&_kjCondition_10,name_57);
  DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
            ((ReaderFor<DynamicStruct> *)&_kjCondition_23,(Reader *)&_kjCondition);
  name_58.content.size_ = 10;
  name_58.content.ptr = "textField";
  DynamicStruct::Reader::get(&local_1b0,(Reader *)&_kjCondition_23,name_58);
  local_40 = (ArrayPtr<const_char>)
             DynamicValue::Reader::AsImpl<capnp::Text,_(capnp::Kind)1>::apply(&local_1b0);
  kj::_::DebugExpression<char_const(&)[1]>::operator==
            (&_kjCondition_27,(DebugExpression<char_const(&)[1]> *)&local_48,(Reader *)&local_40);
  DynamicValue::Reader::~Reader(&local_1b0);
  DynamicValue::Reader::~Reader((Reader *)&_kjCondition);
  if ((_kjCondition_27.result == false) && (kj::_::Debug::minSeverity < 3)) {
    name_59.content.size_ = 0xc;
    name_59.content.ptr = "structField";
    DynamicStruct::Reader::get((Reader *)&_kjCondition,(Reader *)&_kjCondition_10,name_59);
    DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
              ((ReaderFor<DynamicStruct> *)&_kjCondition_23,(Reader *)&_kjCondition);
    name_60.content.size_ = 10;
    name_60.content.ptr = "textField";
    DynamicStruct::Reader::get(&local_1b0,(Reader *)&_kjCondition_23,name_60);
    local_40 = (ArrayPtr<const_char>)
               DynamicValue::Reader::AsImpl<capnp::Text,_(capnp::Kind)1>::apply(&local_1b0);
    kj::_::Debug::
    log<char_const(&)[126],kj::_::DebugComparison<char_const(&)[1],capnp::Text::Reader>&,char_const(&)[1],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x233,ERROR,
               "\"failed: expected \" \"(\\\"\\\") == (subSubReader.get(\\\"structField\\\").template as<DynamicStruct>() .get(\\\"textField\\\").template as<Text>())\", _kjCondition, \"\", subSubReader.get(\"structField\").template as<DynamicStruct>() .get(\"textField\").template as<Text>()"
               ,(char (*) [126])
                "failed: expected (\"\") == (subSubReader.get(\"structField\").template as<DynamicStruct>() .get(\"textField\").template as<Text>())"
               ,&_kjCondition_27,(char (*) [1])0x308a6f,(Reader *)&local_40);
    DynamicValue::Reader::~Reader(&local_1b0);
    DynamicValue::Reader::~Reader((Reader *)&_kjCondition);
  }
  name_61.content.size_ = 9;
  name_61.content.ptr = "voidList";
  DynamicStruct::Reader::get(&local_1b0,&subReader,name_61);
  DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            ((ReaderFor<DynamicList> *)&_kjCondition,&local_1b0);
  local_e0 = " == ";
  __kjCondition_10 = (uchar *)0x500000000;
  DynamicValue::Reader::~Reader(&local_1b0);
  if (kj::_::Debug::minSeverity < 3) {
    auVar23._12_4_ = 0;
    auVar23._0_12_ = auStack_ac;
    __kjCondition_23 = (ArrayPtr<const_unsigned_char>)(auVar23 << 0x20);
    name_62.content.size_ = 9;
    name_62.content.ptr = "voidList";
    DynamicStruct::Reader::get(&local_1b0,&subReader,name_62);
    DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
              ((ReaderFor<DynamicList> *)&_kjCondition,&local_1b0);
    _kjCondition_27.left = (char (*) [1])CONCAT44(_kjCondition_27.left._4_4_,5);
    kj::_::Debug::
    log<char_const(&)[87],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x236,ERROR,
               "\"failed: expected \" \"(0u) == (subReader.get(\\\"voidList\\\").template as<DynamicList>().size())\", _kjCondition, 0u, subReader.get(\"voidList\").template as<DynamicList>().size()"
               ,(char (*) [87])
                "failed: expected (0u) == (subReader.get(\"voidList\").template as<DynamicList>().size())"
               ,(DebugComparison<unsigned_int,_unsigned_int> *)&_kjCondition_10,
               (uint *)&_kjCondition_23,(uint *)&_kjCondition_27);
    DynamicValue::Reader::~Reader(&local_1b0);
  }
  name_63.content.size_ = 9;
  name_63.content.ptr = "boolList";
  DynamicStruct::Reader::get(&local_1b0,&subReader,name_63);
  DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            ((ReaderFor<DynamicList> *)&_kjCondition,&local_1b0);
  local_e0 = " == ";
  __kjCondition_10 = (uchar *)0x500000000;
  DynamicValue::Reader::~Reader(&local_1b0);
  if (kj::_::Debug::minSeverity < 3) {
    auVar24._12_4_ = 0;
    auVar24._0_12_ = auStack_ac;
    __kjCondition_23 = (ArrayPtr<const_unsigned_char>)(auVar24 << 0x20);
    name_64.content.size_ = 9;
    name_64.content.ptr = "boolList";
    DynamicStruct::Reader::get(&local_1b0,&subReader,name_64);
    DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
              ((ReaderFor<DynamicList> *)&_kjCondition,&local_1b0);
    _kjCondition_27.left = (char (*) [1])CONCAT44(_kjCondition_27.left._4_4_,5);
    kj::_::Debug::
    log<char_const(&)[87],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x237,ERROR,
               "\"failed: expected \" \"(0u) == (subReader.get(\\\"boolList\\\").template as<DynamicList>().size())\", _kjCondition, 0u, subReader.get(\"boolList\").template as<DynamicList>().size()"
               ,(char (*) [87])
                "failed: expected (0u) == (subReader.get(\"boolList\").template as<DynamicList>().size())"
               ,(DebugComparison<unsigned_int,_unsigned_int> *)&_kjCondition_10,
               (uint *)&_kjCondition_23,(uint *)&_kjCondition_27);
    DynamicValue::Reader::~Reader(&local_1b0);
  }
  name_65.content.size_ = 9;
  name_65.content.ptr = "int8List";
  DynamicStruct::Reader::get(&local_1b0,&subReader,name_65);
  DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            ((ReaderFor<DynamicList> *)&_kjCondition,&local_1b0);
  local_e0 = " == ";
  __kjCondition_10 = (uchar *)0x500000000;
  DynamicValue::Reader::~Reader(&local_1b0);
  if (kj::_::Debug::minSeverity < 3) {
    auVar25._12_4_ = 0;
    auVar25._0_12_ = auStack_ac;
    __kjCondition_23 = (ArrayPtr<const_unsigned_char>)(auVar25 << 0x20);
    name_66.content.size_ = 9;
    name_66.content.ptr = "int8List";
    DynamicStruct::Reader::get(&local_1b0,&subReader,name_66);
    DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
              ((ReaderFor<DynamicList> *)&_kjCondition,&local_1b0);
    _kjCondition_27.left = (char (*) [1])CONCAT44(_kjCondition_27.left._4_4_,5);
    kj::_::Debug::
    log<char_const(&)[87],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x238,ERROR,
               "\"failed: expected \" \"(0u) == (subReader.get(\\\"int8List\\\").template as<DynamicList>().size())\", _kjCondition, 0u, subReader.get(\"int8List\").template as<DynamicList>().size()"
               ,(char (*) [87])
                "failed: expected (0u) == (subReader.get(\"int8List\").template as<DynamicList>().size())"
               ,(DebugComparison<unsigned_int,_unsigned_int> *)&_kjCondition_10,
               (uint *)&_kjCondition_23,(uint *)&_kjCondition_27);
    DynamicValue::Reader::~Reader(&local_1b0);
  }
  name_67.content.size_ = 10;
  name_67.content.ptr = "int16List";
  DynamicStruct::Reader::get(&local_1b0,&subReader,name_67);
  DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            ((ReaderFor<DynamicList> *)&_kjCondition,&local_1b0);
  local_e0 = " == ";
  __kjCondition_10 = (uchar *)0x500000000;
  DynamicValue::Reader::~Reader(&local_1b0);
  if (kj::_::Debug::minSeverity < 3) {
    auVar26._12_4_ = 0;
    auVar26._0_12_ = auStack_ac;
    __kjCondition_23 = (ArrayPtr<const_unsigned_char>)(auVar26 << 0x20);
    name_68.content.size_ = 10;
    name_68.content.ptr = "int16List";
    DynamicStruct::Reader::get(&local_1b0,&subReader,name_68);
    DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
              ((ReaderFor<DynamicList> *)&_kjCondition,&local_1b0);
    _kjCondition_27.left = (char (*) [1])CONCAT44(_kjCondition_27.left._4_4_,5);
    kj::_::Debug::
    log<char_const(&)[88],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x239,ERROR,
               "\"failed: expected \" \"(0u) == (subReader.get(\\\"int16List\\\").template as<DynamicList>().size())\", _kjCondition, 0u, subReader.get(\"int16List\").template as<DynamicList>().size()"
               ,(char (*) [88])
                "failed: expected (0u) == (subReader.get(\"int16List\").template as<DynamicList>().size())"
               ,(DebugComparison<unsigned_int,_unsigned_int> *)&_kjCondition_10,
               (uint *)&_kjCondition_23,(uint *)&_kjCondition_27);
    DynamicValue::Reader::~Reader(&local_1b0);
  }
  name_69.content.size_ = 10;
  name_69.content.ptr = "int32List";
  DynamicStruct::Reader::get(&local_1b0,&subReader,name_69);
  DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            ((ReaderFor<DynamicList> *)&_kjCondition,&local_1b0);
  local_e0 = " == ";
  __kjCondition_10 = (uchar *)0x500000000;
  DynamicValue::Reader::~Reader(&local_1b0);
  if (kj::_::Debug::minSeverity < 3) {
    auVar27._12_4_ = 0;
    auVar27._0_12_ = auStack_ac;
    __kjCondition_23 = (ArrayPtr<const_unsigned_char>)(auVar27 << 0x20);
    name_70.content.size_ = 10;
    name_70.content.ptr = "int32List";
    DynamicStruct::Reader::get(&local_1b0,&subReader,name_70);
    DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
              ((ReaderFor<DynamicList> *)&_kjCondition,&local_1b0);
    _kjCondition_27.left = (char (*) [1])CONCAT44(_kjCondition_27.left._4_4_,5);
    kj::_::Debug::
    log<char_const(&)[88],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x23a,ERROR,
               "\"failed: expected \" \"(0u) == (subReader.get(\\\"int32List\\\").template as<DynamicList>().size())\", _kjCondition, 0u, subReader.get(\"int32List\").template as<DynamicList>().size()"
               ,(char (*) [88])
                "failed: expected (0u) == (subReader.get(\"int32List\").template as<DynamicList>().size())"
               ,(DebugComparison<unsigned_int,_unsigned_int> *)&_kjCondition_10,
               (uint *)&_kjCondition_23,(uint *)&_kjCondition_27);
    DynamicValue::Reader::~Reader(&local_1b0);
  }
  name_71.content.size_ = 10;
  name_71.content.ptr = "int64List";
  DynamicStruct::Reader::get(&local_1b0,&subReader,name_71);
  DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            ((ReaderFor<DynamicList> *)&_kjCondition,&local_1b0);
  local_e0 = " == ";
  __kjCondition_10 = (uchar *)0x500000000;
  DynamicValue::Reader::~Reader(&local_1b0);
  if (kj::_::Debug::minSeverity < 3) {
    auVar28._12_4_ = 0;
    auVar28._0_12_ = auStack_ac;
    __kjCondition_23 = (ArrayPtr<const_unsigned_char>)(auVar28 << 0x20);
    name_72.content.size_ = 10;
    name_72.content.ptr = "int64List";
    DynamicStruct::Reader::get(&local_1b0,&subReader,name_72);
    DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
              ((ReaderFor<DynamicList> *)&_kjCondition,&local_1b0);
    _kjCondition_27.left = (char (*) [1])CONCAT44(_kjCondition_27.left._4_4_,5);
    kj::_::Debug::
    log<char_const(&)[88],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x23b,ERROR,
               "\"failed: expected \" \"(0u) == (subReader.get(\\\"int64List\\\").template as<DynamicList>().size())\", _kjCondition, 0u, subReader.get(\"int64List\").template as<DynamicList>().size()"
               ,(char (*) [88])
                "failed: expected (0u) == (subReader.get(\"int64List\").template as<DynamicList>().size())"
               ,(DebugComparison<unsigned_int,_unsigned_int> *)&_kjCondition_10,
               (uint *)&_kjCondition_23,(uint *)&_kjCondition_27);
    DynamicValue::Reader::~Reader(&local_1b0);
  }
  name_73.content.size_ = 10;
  name_73.content.ptr = "uInt8List";
  DynamicStruct::Reader::get(&local_1b0,&subReader,name_73);
  DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            ((ReaderFor<DynamicList> *)&_kjCondition,&local_1b0);
  local_e0 = " == ";
  __kjCondition_10 = (uchar *)0x500000000;
  DynamicValue::Reader::~Reader(&local_1b0);
  if (kj::_::Debug::minSeverity < 3) {
    auVar29._12_4_ = 0;
    auVar29._0_12_ = auStack_ac;
    __kjCondition_23 = (ArrayPtr<const_unsigned_char>)(auVar29 << 0x20);
    name_74.content.size_ = 10;
    name_74.content.ptr = "uInt8List";
    DynamicStruct::Reader::get(&local_1b0,&subReader,name_74);
    DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
              ((ReaderFor<DynamicList> *)&_kjCondition,&local_1b0);
    _kjCondition_27.left = (char (*) [1])CONCAT44(_kjCondition_27.left._4_4_,5);
    kj::_::Debug::
    log<char_const(&)[88],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x23c,ERROR,
               "\"failed: expected \" \"(0u) == (subReader.get(\\\"uInt8List\\\").template as<DynamicList>().size())\", _kjCondition, 0u, subReader.get(\"uInt8List\").template as<DynamicList>().size()"
               ,(char (*) [88])
                "failed: expected (0u) == (subReader.get(\"uInt8List\").template as<DynamicList>().size())"
               ,(DebugComparison<unsigned_int,_unsigned_int> *)&_kjCondition_10,
               (uint *)&_kjCondition_23,(uint *)&_kjCondition_27);
    DynamicValue::Reader::~Reader(&local_1b0);
  }
  name_75.content.size_ = 0xb;
  name_75.content.ptr = "uInt16List";
  DynamicStruct::Reader::get(&local_1b0,&subReader,name_75);
  DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            ((ReaderFor<DynamicList> *)&_kjCondition,&local_1b0);
  local_e0 = " == ";
  __kjCondition_10 = (uchar *)0x500000000;
  DynamicValue::Reader::~Reader(&local_1b0);
  if (kj::_::Debug::minSeverity < 3) {
    auVar30._12_4_ = 0;
    auVar30._0_12_ = auStack_ac;
    __kjCondition_23 = (ArrayPtr<const_unsigned_char>)(auVar30 << 0x20);
    name_76.content.size_ = 0xb;
    name_76.content.ptr = "uInt16List";
    DynamicStruct::Reader::get(&local_1b0,&subReader,name_76);
    DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
              ((ReaderFor<DynamicList> *)&_kjCondition,&local_1b0);
    _kjCondition_27.left = (char (*) [1])CONCAT44(_kjCondition_27.left._4_4_,5);
    kj::_::Debug::
    log<char_const(&)[89],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x23d,ERROR,
               "\"failed: expected \" \"(0u) == (subReader.get(\\\"uInt16List\\\").template as<DynamicList>().size())\", _kjCondition, 0u, subReader.get(\"uInt16List\").template as<DynamicList>().size()"
               ,(char (*) [89])
                "failed: expected (0u) == (subReader.get(\"uInt16List\").template as<DynamicList>().size())"
               ,(DebugComparison<unsigned_int,_unsigned_int> *)&_kjCondition_10,
               (uint *)&_kjCondition_23,(uint *)&_kjCondition_27);
    DynamicValue::Reader::~Reader(&local_1b0);
  }
  name_77.content.size_ = 0xb;
  name_77.content.ptr = "uInt32List";
  DynamicStruct::Reader::get(&local_1b0,&subReader,name_77);
  DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            ((ReaderFor<DynamicList> *)&_kjCondition,&local_1b0);
  local_e0 = " == ";
  __kjCondition_10 = (uchar *)0x500000000;
  DynamicValue::Reader::~Reader(&local_1b0);
  if (kj::_::Debug::minSeverity < 3) {
    auVar31._12_4_ = 0;
    auVar31._0_12_ = auStack_ac;
    __kjCondition_23 = (ArrayPtr<const_unsigned_char>)(auVar31 << 0x20);
    name_78.content.size_ = 0xb;
    name_78.content.ptr = "uInt32List";
    DynamicStruct::Reader::get(&local_1b0,&subReader,name_78);
    DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
              ((ReaderFor<DynamicList> *)&_kjCondition,&local_1b0);
    _kjCondition_27.left = (char (*) [1])CONCAT44(_kjCondition_27.left._4_4_,5);
    kj::_::Debug::
    log<char_const(&)[89],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x23e,ERROR,
               "\"failed: expected \" \"(0u) == (subReader.get(\\\"uInt32List\\\").template as<DynamicList>().size())\", _kjCondition, 0u, subReader.get(\"uInt32List\").template as<DynamicList>().size()"
               ,(char (*) [89])
                "failed: expected (0u) == (subReader.get(\"uInt32List\").template as<DynamicList>().size())"
               ,(DebugComparison<unsigned_int,_unsigned_int> *)&_kjCondition_10,
               (uint *)&_kjCondition_23,(uint *)&_kjCondition_27);
    DynamicValue::Reader::~Reader(&local_1b0);
  }
  name_79.content.size_ = 0xb;
  name_79.content.ptr = "uInt64List";
  DynamicStruct::Reader::get(&local_1b0,&subReader,name_79);
  DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            ((ReaderFor<DynamicList> *)&_kjCondition,&local_1b0);
  local_e0 = " == ";
  __kjCondition_10 = (uchar *)0x500000000;
  DynamicValue::Reader::~Reader(&local_1b0);
  if (kj::_::Debug::minSeverity < 3) {
    auVar32._12_4_ = 0;
    auVar32._0_12_ = auStack_ac;
    __kjCondition_23 = (ArrayPtr<const_unsigned_char>)(auVar32 << 0x20);
    name_80.content.size_ = 0xb;
    name_80.content.ptr = "uInt64List";
    DynamicStruct::Reader::get(&local_1b0,&subReader,name_80);
    DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
              ((ReaderFor<DynamicList> *)&_kjCondition,&local_1b0);
    _kjCondition_27.left = (char (*) [1])CONCAT44(_kjCondition_27.left._4_4_,5);
    kj::_::Debug::
    log<char_const(&)[89],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x23f,ERROR,
               "\"failed: expected \" \"(0u) == (subReader.get(\\\"uInt64List\\\").template as<DynamicList>().size())\", _kjCondition, 0u, subReader.get(\"uInt64List\").template as<DynamicList>().size()"
               ,(char (*) [89])
                "failed: expected (0u) == (subReader.get(\"uInt64List\").template as<DynamicList>().size())"
               ,(DebugComparison<unsigned_int,_unsigned_int> *)&_kjCondition_10,
               (uint *)&_kjCondition_23,(uint *)&_kjCondition_27);
    DynamicValue::Reader::~Reader(&local_1b0);
  }
  name_81.content.size_ = 0xc;
  name_81.content.ptr = "float32List";
  DynamicStruct::Reader::get(&local_1b0,&subReader,name_81);
  DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            ((ReaderFor<DynamicList> *)&_kjCondition,&local_1b0);
  local_e0 = " == ";
  __kjCondition_10 = (uchar *)0x500000000;
  DynamicValue::Reader::~Reader(&local_1b0);
  if (kj::_::Debug::minSeverity < 3) {
    auVar33._12_4_ = 0;
    auVar33._0_12_ = auStack_ac;
    __kjCondition_23 = (ArrayPtr<const_unsigned_char>)(auVar33 << 0x20);
    name_82.content.size_ = 0xc;
    name_82.content.ptr = "float32List";
    DynamicStruct::Reader::get(&local_1b0,&subReader,name_82);
    DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
              ((ReaderFor<DynamicList> *)&_kjCondition,&local_1b0);
    _kjCondition_27.left = (char (*) [1])CONCAT44(_kjCondition_27.left._4_4_,5);
    kj::_::Debug::
    log<char_const(&)[90],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x240,ERROR,
               "\"failed: expected \" \"(0u) == (subReader.get(\\\"float32List\\\").template as<DynamicList>().size())\", _kjCondition, 0u, subReader.get(\"float32List\").template as<DynamicList>().size()"
               ,(char (*) [90])
                "failed: expected (0u) == (subReader.get(\"float32List\").template as<DynamicList>().size())"
               ,(DebugComparison<unsigned_int,_unsigned_int> *)&_kjCondition_10,
               (uint *)&_kjCondition_23,(uint *)&_kjCondition_27);
    DynamicValue::Reader::~Reader(&local_1b0);
  }
  name_83.content.size_ = 0xc;
  name_83.content.ptr = "float64List";
  DynamicStruct::Reader::get(&local_1b0,&subReader,name_83);
  DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            ((ReaderFor<DynamicList> *)&_kjCondition,&local_1b0);
  local_e0 = " == ";
  __kjCondition_10 = (uchar *)0x500000000;
  DynamicValue::Reader::~Reader(&local_1b0);
  if (kj::_::Debug::minSeverity < 3) {
    auVar34._12_4_ = 0;
    auVar34._0_12_ = auStack_ac;
    __kjCondition_23 = (ArrayPtr<const_unsigned_char>)(auVar34 << 0x20);
    name_84.content.size_ = 0xc;
    name_84.content.ptr = "float64List";
    DynamicStruct::Reader::get(&local_1b0,&subReader,name_84);
    DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
              ((ReaderFor<DynamicList> *)&_kjCondition,&local_1b0);
    _kjCondition_27.left = (char (*) [1])CONCAT44(_kjCondition_27.left._4_4_,5);
    kj::_::Debug::
    log<char_const(&)[90],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x241,ERROR,
               "\"failed: expected \" \"(0u) == (subReader.get(\\\"float64List\\\").template as<DynamicList>().size())\", _kjCondition, 0u, subReader.get(\"float64List\").template as<DynamicList>().size()"
               ,(char (*) [90])
                "failed: expected (0u) == (subReader.get(\"float64List\").template as<DynamicList>().size())"
               ,(DebugComparison<unsigned_int,_unsigned_int> *)&_kjCondition_10,
               (uint *)&_kjCondition_23,(uint *)&_kjCondition_27);
    DynamicValue::Reader::~Reader(&local_1b0);
  }
  name_85.content.size_ = 9;
  name_85.content.ptr = "textList";
  DynamicStruct::Reader::get(&local_1b0,&subReader,name_85);
  DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            ((ReaderFor<DynamicList> *)&_kjCondition,&local_1b0);
  local_e0 = " == ";
  __kjCondition_10 = (uchar *)0x500000000;
  DynamicValue::Reader::~Reader(&local_1b0);
  if (kj::_::Debug::minSeverity < 3) {
    auVar35._12_4_ = 0;
    auVar35._0_12_ = auStack_ac;
    __kjCondition_23 = (ArrayPtr<const_unsigned_char>)(auVar35 << 0x20);
    name_86.content.size_ = 9;
    name_86.content.ptr = "textList";
    DynamicStruct::Reader::get(&local_1b0,&subReader,name_86);
    DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
              ((ReaderFor<DynamicList> *)&_kjCondition,&local_1b0);
    _kjCondition_27.left = (char (*) [1])CONCAT44(_kjCondition_27.left._4_4_,5);
    kj::_::Debug::
    log<char_const(&)[87],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x242,ERROR,
               "\"failed: expected \" \"(0u) == (subReader.get(\\\"textList\\\").template as<DynamicList>().size())\", _kjCondition, 0u, subReader.get(\"textList\").template as<DynamicList>().size()"
               ,(char (*) [87])
                "failed: expected (0u) == (subReader.get(\"textList\").template as<DynamicList>().size())"
               ,(DebugComparison<unsigned_int,_unsigned_int> *)&_kjCondition_10,
               (uint *)&_kjCondition_23,(uint *)&_kjCondition_27);
    DynamicValue::Reader::~Reader(&local_1b0);
  }
  name_87.content.size_ = 9;
  name_87.content.ptr = "dataList";
  DynamicStruct::Reader::get(&local_1b0,&subReader,name_87);
  DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            ((ReaderFor<DynamicList> *)&_kjCondition,&local_1b0);
  local_e0 = " == ";
  __kjCondition_10 = (uchar *)0x500000000;
  DynamicValue::Reader::~Reader(&local_1b0);
  if (kj::_::Debug::minSeverity < 3) {
    auVar36._12_4_ = 0;
    auVar36._0_12_ = auStack_ac;
    __kjCondition_23 = (ArrayPtr<const_unsigned_char>)(auVar36 << 0x20);
    name_88.content.size_ = 9;
    name_88.content.ptr = "dataList";
    DynamicStruct::Reader::get(&local_1b0,&subReader,name_88);
    DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
              ((ReaderFor<DynamicList> *)&_kjCondition,&local_1b0);
    _kjCondition_27.left = (char (*) [1])CONCAT44(_kjCondition_27.left._4_4_,5);
    kj::_::Debug::
    log<char_const(&)[87],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x243,ERROR,
               "\"failed: expected \" \"(0u) == (subReader.get(\\\"dataList\\\").template as<DynamicList>().size())\", _kjCondition, 0u, subReader.get(\"dataList\").template as<DynamicList>().size()"
               ,(char (*) [87])
                "failed: expected (0u) == (subReader.get(\"dataList\").template as<DynamicList>().size())"
               ,(DebugComparison<unsigned_int,_unsigned_int> *)&_kjCondition_10,
               (uint *)&_kjCondition_23,(uint *)&_kjCondition_27);
    DynamicValue::Reader::~Reader(&local_1b0);
  }
  name_89.content.size_ = 0xb;
  name_89.content.ptr = "structList";
  DynamicStruct::Reader::get(&local_1b0,&subReader,name_89);
  DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            ((ReaderFor<DynamicList> *)&_kjCondition,&local_1b0);
  local_e0 = " == ";
  __kjCondition_10 = (uchar *)0x500000000;
  DynamicValue::Reader::~Reader(&local_1b0);
  if (kj::_::Debug::minSeverity < 3) {
    auVar37._12_4_ = 0;
    auVar37._0_12_ = auStack_ac;
    __kjCondition_23 = (ArrayPtr<const_unsigned_char>)(auVar37 << 0x20);
    name_90.content.size_ = 0xb;
    name_90.content.ptr = "structList";
    DynamicStruct::Reader::get(&local_1b0,&subReader,name_90);
    DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
              ((ReaderFor<DynamicList> *)&_kjCondition,&local_1b0);
    _kjCondition_27.left = (char (*) [1])CONCAT44(_kjCondition_27.left._4_4_,5);
    kj::_::Debug::
    log<char_const(&)[89],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x244,ERROR,
               "\"failed: expected \" \"(0u) == (subReader.get(\\\"structList\\\").template as<DynamicList>().size())\", _kjCondition, 0u, subReader.get(\"structList\").template as<DynamicList>().size()"
               ,(char (*) [89])
                "failed: expected (0u) == (subReader.get(\"structList\").template as<DynamicList>().size())"
               ,(DebugComparison<unsigned_int,_unsigned_int> *)&_kjCondition_10,
               (uint *)&_kjCondition_23,(uint *)&_kjCondition_27);
    DynamicValue::Reader::~Reader(&local_1b0);
  }
  name_91.content.size_ = 9;
  name_91.content.ptr = "voidList";
  DynamicStruct::Reader::get(&local_1b0,&reader,name_91);
  DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            ((ReaderFor<DynamicList> *)&_kjCondition,&local_1b0);
  subReader.reader.data._0_1_ = '\0';
  subReader.reader.segment = (SegmentReader *)" == ";
  subReader.schema.super_Schema.raw = (Schema)0x500000000;
  subReader.reader.capTable = (CapTableReader *)&DAT_00000005;
  DynamicValue::Reader::~Reader(&local_1b0);
  if (((char)subReader.reader.data == '\0') && (kj::_::Debug::minSeverity < 3)) {
    auVar38._12_4_ = 0;
    auVar38._0_12_ = stack0xffffffffffffff1c;
    __kjCondition_10 = (ArrayPtr<const_unsigned_char>)(auVar38 << 0x20);
    name_92.content.size_ = 9;
    name_92.content.ptr = "voidList";
    DynamicStruct::Reader::get(&local_1b0,&reader,name_92);
    DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
              ((ReaderFor<DynamicList> *)&_kjCondition,&local_1b0);
    __kjCondition_23 = 5;
    kj::_::Debug::
    log<char_const(&)[84],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x247,ERROR,
               "\"failed: expected \" \"(0u) == (reader.get(\\\"voidList\\\").template as<DynamicList>().size())\", _kjCondition, 0u, reader.get(\"voidList\").template as<DynamicList>().size()"
               ,(char (*) [84])
                "failed: expected (0u) == (reader.get(\"voidList\").template as<DynamicList>().size())"
               ,(DebugComparison<unsigned_int,_unsigned_int> *)&subReader,(uint *)&_kjCondition_10,
               (uint *)&_kjCondition_23);
    DynamicValue::Reader::~Reader(&local_1b0);
  }
  name_93.content.size_ = 9;
  name_93.content.ptr = "boolList";
  DynamicStruct::Reader::get(&local_1b0,&reader,name_93);
  DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            ((ReaderFor<DynamicList> *)&_kjCondition,&local_1b0);
  subReader.reader.data._0_1_ = '\0';
  subReader.reader.segment = (SegmentReader *)" == ";
  subReader.schema.super_Schema.raw = (Schema)0x500000000;
  subReader.reader.capTable = (CapTableReader *)&DAT_00000005;
  DynamicValue::Reader::~Reader(&local_1b0);
  if (((char)subReader.reader.data == '\0') && (kj::_::Debug::minSeverity < 3)) {
    auVar39._12_4_ = 0;
    auVar39._0_12_ = stack0xffffffffffffff1c;
    __kjCondition_10 = (ArrayPtr<const_unsigned_char>)(auVar39 << 0x20);
    name_94.content.size_ = 9;
    name_94.content.ptr = "boolList";
    DynamicStruct::Reader::get(&local_1b0,&reader,name_94);
    DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
              ((ReaderFor<DynamicList> *)&_kjCondition,&local_1b0);
    __kjCondition_23 = 5;
    kj::_::Debug::
    log<char_const(&)[84],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x248,ERROR,
               "\"failed: expected \" \"(0u) == (reader.get(\\\"boolList\\\").template as<DynamicList>().size())\", _kjCondition, 0u, reader.get(\"boolList\").template as<DynamicList>().size()"
               ,(char (*) [84])
                "failed: expected (0u) == (reader.get(\"boolList\").template as<DynamicList>().size())"
               ,(DebugComparison<unsigned_int,_unsigned_int> *)&subReader,(uint *)&_kjCondition_10,
               (uint *)&_kjCondition_23);
    DynamicValue::Reader::~Reader(&local_1b0);
  }
  name_95.content.size_ = 9;
  name_95.content.ptr = "int8List";
  DynamicStruct::Reader::get(&local_1b0,&reader,name_95);
  DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            ((ReaderFor<DynamicList> *)&_kjCondition,&local_1b0);
  subReader.reader.data._0_1_ = '\0';
  subReader.reader.segment = (SegmentReader *)" == ";
  subReader.schema.super_Schema.raw = (Schema)0x500000000;
  subReader.reader.capTable = (CapTableReader *)&DAT_00000005;
  DynamicValue::Reader::~Reader(&local_1b0);
  if (((char)subReader.reader.data == '\0') && (kj::_::Debug::minSeverity < 3)) {
    auVar40._12_4_ = 0;
    auVar40._0_12_ = stack0xffffffffffffff1c;
    __kjCondition_10 = (ArrayPtr<const_unsigned_char>)(auVar40 << 0x20);
    name_96.content.size_ = 9;
    name_96.content.ptr = "int8List";
    DynamicStruct::Reader::get(&local_1b0,&reader,name_96);
    DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
              ((ReaderFor<DynamicList> *)&_kjCondition,&local_1b0);
    __kjCondition_23 = 5;
    kj::_::Debug::
    log<char_const(&)[84],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x249,ERROR,
               "\"failed: expected \" \"(0u) == (reader.get(\\\"int8List\\\").template as<DynamicList>().size())\", _kjCondition, 0u, reader.get(\"int8List\").template as<DynamicList>().size()"
               ,(char (*) [84])
                "failed: expected (0u) == (reader.get(\"int8List\").template as<DynamicList>().size())"
               ,(DebugComparison<unsigned_int,_unsigned_int> *)&subReader,(uint *)&_kjCondition_10,
               (uint *)&_kjCondition_23);
    DynamicValue::Reader::~Reader(&local_1b0);
  }
  name_97.content.size_ = 10;
  name_97.content.ptr = "int16List";
  DynamicStruct::Reader::get(&local_1b0,&reader,name_97);
  DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            ((ReaderFor<DynamicList> *)&_kjCondition,&local_1b0);
  subReader.reader.data._0_1_ = '\0';
  subReader.reader.segment = (SegmentReader *)" == ";
  subReader.schema.super_Schema.raw = (Schema)0x500000000;
  subReader.reader.capTable = (CapTableReader *)&DAT_00000005;
  DynamicValue::Reader::~Reader(&local_1b0);
  if (((char)subReader.reader.data == '\0') && (kj::_::Debug::minSeverity < 3)) {
    auVar41._12_4_ = 0;
    auVar41._0_12_ = stack0xffffffffffffff1c;
    __kjCondition_10 = (ArrayPtr<const_unsigned_char>)(auVar41 << 0x20);
    name_98.content.size_ = 10;
    name_98.content.ptr = "int16List";
    DynamicStruct::Reader::get(&local_1b0,&reader,name_98);
    DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
              ((ReaderFor<DynamicList> *)&_kjCondition,&local_1b0);
    __kjCondition_23 = 5;
    kj::_::Debug::
    log<char_const(&)[85],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x24a,ERROR,
               "\"failed: expected \" \"(0u) == (reader.get(\\\"int16List\\\").template as<DynamicList>().size())\", _kjCondition, 0u, reader.get(\"int16List\").template as<DynamicList>().size()"
               ,(char (*) [85])
                "failed: expected (0u) == (reader.get(\"int16List\").template as<DynamicList>().size())"
               ,(DebugComparison<unsigned_int,_unsigned_int> *)&subReader,(uint *)&_kjCondition_10,
               (uint *)&_kjCondition_23);
    DynamicValue::Reader::~Reader(&local_1b0);
  }
  name_99.content.size_ = 10;
  name_99.content.ptr = "int32List";
  DynamicStruct::Reader::get(&local_1b0,&reader,name_99);
  DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            ((ReaderFor<DynamicList> *)&_kjCondition,&local_1b0);
  subReader.reader.data._0_1_ = '\0';
  subReader.reader.segment = (SegmentReader *)" == ";
  subReader.schema.super_Schema.raw = (Schema)0x500000000;
  subReader.reader.capTable = (CapTableReader *)&DAT_00000005;
  DynamicValue::Reader::~Reader(&local_1b0);
  if (((char)subReader.reader.data == '\0') && (kj::_::Debug::minSeverity < 3)) {
    auVar42._12_4_ = 0;
    auVar42._0_12_ = stack0xffffffffffffff1c;
    __kjCondition_10 = (ArrayPtr<const_unsigned_char>)(auVar42 << 0x20);
    name_x00100.content.size_ = 10;
    name_x00100.content.ptr = "int32List";
    DynamicStruct::Reader::get(&local_1b0,&reader,name_x00100);
    DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
              ((ReaderFor<DynamicList> *)&_kjCondition,&local_1b0);
    __kjCondition_23 = 5;
    kj::_::Debug::
    log<char_const(&)[85],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x24b,ERROR,
               "\"failed: expected \" \"(0u) == (reader.get(\\\"int32List\\\").template as<DynamicList>().size())\", _kjCondition, 0u, reader.get(\"int32List\").template as<DynamicList>().size()"
               ,(char (*) [85])
                "failed: expected (0u) == (reader.get(\"int32List\").template as<DynamicList>().size())"
               ,(DebugComparison<unsigned_int,_unsigned_int> *)&subReader,(uint *)&_kjCondition_10,
               (uint *)&_kjCondition_23);
    DynamicValue::Reader::~Reader(&local_1b0);
  }
  name_x00101.content.size_ = 10;
  name_x00101.content.ptr = "int64List";
  DynamicStruct::Reader::get(&local_1b0,&reader,name_x00101);
  DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            ((ReaderFor<DynamicList> *)&_kjCondition,&local_1b0);
  subReader.reader.data._0_1_ = '\0';
  subReader.reader.segment = (SegmentReader *)" == ";
  subReader.schema.super_Schema.raw = (Schema)0x500000000;
  subReader.reader.capTable = (CapTableReader *)&DAT_00000005;
  DynamicValue::Reader::~Reader(&local_1b0);
  if (((char)subReader.reader.data == '\0') && (kj::_::Debug::minSeverity < 3)) {
    auVar43._12_4_ = 0;
    auVar43._0_12_ = stack0xffffffffffffff1c;
    __kjCondition_10 = (ArrayPtr<const_unsigned_char>)(auVar43 << 0x20);
    name_x00102.content.size_ = 10;
    name_x00102.content.ptr = "int64List";
    DynamicStruct::Reader::get(&local_1b0,&reader,name_x00102);
    DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
              ((ReaderFor<DynamicList> *)&_kjCondition,&local_1b0);
    __kjCondition_23 = 5;
    kj::_::Debug::
    log<char_const(&)[85],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x24c,ERROR,
               "\"failed: expected \" \"(0u) == (reader.get(\\\"int64List\\\").template as<DynamicList>().size())\", _kjCondition, 0u, reader.get(\"int64List\").template as<DynamicList>().size()"
               ,(char (*) [85])
                "failed: expected (0u) == (reader.get(\"int64List\").template as<DynamicList>().size())"
               ,(DebugComparison<unsigned_int,_unsigned_int> *)&subReader,(uint *)&_kjCondition_10,
               (uint *)&_kjCondition_23);
    DynamicValue::Reader::~Reader(&local_1b0);
  }
  name_x00103.content.size_ = 10;
  name_x00103.content.ptr = "uInt8List";
  DynamicStruct::Reader::get(&local_1b0,&reader,name_x00103);
  DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            ((ReaderFor<DynamicList> *)&_kjCondition,&local_1b0);
  subReader.reader.data._0_1_ = '\0';
  subReader.reader.segment = (SegmentReader *)" == ";
  subReader.schema.super_Schema.raw = (Schema)0x500000000;
  subReader.reader.capTable = (CapTableReader *)&DAT_00000005;
  DynamicValue::Reader::~Reader(&local_1b0);
  if (((char)subReader.reader.data == '\0') && (kj::_::Debug::minSeverity < 3)) {
    auVar44._12_4_ = 0;
    auVar44._0_12_ = stack0xffffffffffffff1c;
    __kjCondition_10 = (ArrayPtr<const_unsigned_char>)(auVar44 << 0x20);
    name_x00104.content.size_ = 10;
    name_x00104.content.ptr = "uInt8List";
    DynamicStruct::Reader::get(&local_1b0,&reader,name_x00104);
    DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
              ((ReaderFor<DynamicList> *)&_kjCondition,&local_1b0);
    __kjCondition_23 = 5;
    kj::_::Debug::
    log<char_const(&)[85],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x24d,ERROR,
               "\"failed: expected \" \"(0u) == (reader.get(\\\"uInt8List\\\").template as<DynamicList>().size())\", _kjCondition, 0u, reader.get(\"uInt8List\").template as<DynamicList>().size()"
               ,(char (*) [85])
                "failed: expected (0u) == (reader.get(\"uInt8List\").template as<DynamicList>().size())"
               ,(DebugComparison<unsigned_int,_unsigned_int> *)&subReader,(uint *)&_kjCondition_10,
               (uint *)&_kjCondition_23);
    DynamicValue::Reader::~Reader(&local_1b0);
  }
  name_x00105.content.size_ = 0xb;
  name_x00105.content.ptr = "uInt16List";
  DynamicStruct::Reader::get(&local_1b0,&reader,name_x00105);
  DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            ((ReaderFor<DynamicList> *)&_kjCondition,&local_1b0);
  subReader.reader.data._0_1_ = '\0';
  subReader.reader.segment = (SegmentReader *)" == ";
  subReader.schema.super_Schema.raw = (Schema)0x500000000;
  subReader.reader.capTable = (CapTableReader *)&DAT_00000005;
  DynamicValue::Reader::~Reader(&local_1b0);
  if (((char)subReader.reader.data == '\0') && (kj::_::Debug::minSeverity < 3)) {
    auVar45._12_4_ = 0;
    auVar45._0_12_ = stack0xffffffffffffff1c;
    __kjCondition_10 = (ArrayPtr<const_unsigned_char>)(auVar45 << 0x20);
    name_x00106.content.size_ = 0xb;
    name_x00106.content.ptr = "uInt16List";
    DynamicStruct::Reader::get(&local_1b0,&reader,name_x00106);
    DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
              ((ReaderFor<DynamicList> *)&_kjCondition,&local_1b0);
    __kjCondition_23 = 5;
    kj::_::Debug::
    log<char_const(&)[86],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x24e,ERROR,
               "\"failed: expected \" \"(0u) == (reader.get(\\\"uInt16List\\\").template as<DynamicList>().size())\", _kjCondition, 0u, reader.get(\"uInt16List\").template as<DynamicList>().size()"
               ,(char (*) [86])
                "failed: expected (0u) == (reader.get(\"uInt16List\").template as<DynamicList>().size())"
               ,(DebugComparison<unsigned_int,_unsigned_int> *)&subReader,(uint *)&_kjCondition_10,
               (uint *)&_kjCondition_23);
    DynamicValue::Reader::~Reader(&local_1b0);
  }
  name_x00107.content.size_ = 0xb;
  name_x00107.content.ptr = "uInt32List";
  DynamicStruct::Reader::get(&local_1b0,&reader,name_x00107);
  DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            ((ReaderFor<DynamicList> *)&_kjCondition,&local_1b0);
  subReader.reader.data._0_1_ = '\0';
  subReader.reader.segment = (SegmentReader *)" == ";
  subReader.schema.super_Schema.raw = (Schema)0x500000000;
  subReader.reader.capTable = (CapTableReader *)&DAT_00000005;
  DynamicValue::Reader::~Reader(&local_1b0);
  if (((char)subReader.reader.data == '\0') && (kj::_::Debug::minSeverity < 3)) {
    auVar46._12_4_ = 0;
    auVar46._0_12_ = stack0xffffffffffffff1c;
    __kjCondition_10 = (ArrayPtr<const_unsigned_char>)(auVar46 << 0x20);
    name_x00108.content.size_ = 0xb;
    name_x00108.content.ptr = "uInt32List";
    DynamicStruct::Reader::get(&local_1b0,&reader,name_x00108);
    DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
              ((ReaderFor<DynamicList> *)&_kjCondition,&local_1b0);
    __kjCondition_23 = 5;
    kj::_::Debug::
    log<char_const(&)[86],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x24f,ERROR,
               "\"failed: expected \" \"(0u) == (reader.get(\\\"uInt32List\\\").template as<DynamicList>().size())\", _kjCondition, 0u, reader.get(\"uInt32List\").template as<DynamicList>().size()"
               ,(char (*) [86])
                "failed: expected (0u) == (reader.get(\"uInt32List\").template as<DynamicList>().size())"
               ,(DebugComparison<unsigned_int,_unsigned_int> *)&subReader,(uint *)&_kjCondition_10,
               (uint *)&_kjCondition_23);
    DynamicValue::Reader::~Reader(&local_1b0);
  }
  name_x00109.content.size_ = 0xb;
  name_x00109.content.ptr = "uInt64List";
  DynamicStruct::Reader::get(&local_1b0,&reader,name_x00109);
  DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            ((ReaderFor<DynamicList> *)&_kjCondition,&local_1b0);
  subReader.reader.data._0_1_ = '\0';
  subReader.reader.segment = (SegmentReader *)" == ";
  subReader.schema.super_Schema.raw = (Schema)0x500000000;
  subReader.reader.capTable = (CapTableReader *)&DAT_00000005;
  DynamicValue::Reader::~Reader(&local_1b0);
  if (((char)subReader.reader.data == '\0') && (kj::_::Debug::minSeverity < 3)) {
    auVar47._12_4_ = 0;
    auVar47._0_12_ = stack0xffffffffffffff1c;
    __kjCondition_10 = (ArrayPtr<const_unsigned_char>)(auVar47 << 0x20);
    name_x00110.content.size_ = 0xb;
    name_x00110.content.ptr = "uInt64List";
    DynamicStruct::Reader::get(&local_1b0,&reader,name_x00110);
    DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
              ((ReaderFor<DynamicList> *)&_kjCondition,&local_1b0);
    __kjCondition_23 = 5;
    kj::_::Debug::
    log<char_const(&)[86],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x250,ERROR,
               "\"failed: expected \" \"(0u) == (reader.get(\\\"uInt64List\\\").template as<DynamicList>().size())\", _kjCondition, 0u, reader.get(\"uInt64List\").template as<DynamicList>().size()"
               ,(char (*) [86])
                "failed: expected (0u) == (reader.get(\"uInt64List\").template as<DynamicList>().size())"
               ,(DebugComparison<unsigned_int,_unsigned_int> *)&subReader,(uint *)&_kjCondition_10,
               (uint *)&_kjCondition_23);
    DynamicValue::Reader::~Reader(&local_1b0);
  }
  name_x00111.content.size_ = 0xc;
  name_x00111.content.ptr = "float32List";
  DynamicStruct::Reader::get(&local_1b0,&reader,name_x00111);
  DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            ((ReaderFor<DynamicList> *)&_kjCondition,&local_1b0);
  subReader.reader.data._0_1_ = '\0';
  subReader.reader.segment = (SegmentReader *)" == ";
  subReader.schema.super_Schema.raw = (Schema)0x500000000;
  subReader.reader.capTable = (CapTableReader *)&DAT_00000005;
  DynamicValue::Reader::~Reader(&local_1b0);
  if (((char)subReader.reader.data == '\0') && (kj::_::Debug::minSeverity < 3)) {
    auVar48._12_4_ = 0;
    auVar48._0_12_ = stack0xffffffffffffff1c;
    __kjCondition_10 = (ArrayPtr<const_unsigned_char>)(auVar48 << 0x20);
    name_x00112.content.size_ = 0xc;
    name_x00112.content.ptr = "float32List";
    DynamicStruct::Reader::get(&local_1b0,&reader,name_x00112);
    DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
              ((ReaderFor<DynamicList> *)&_kjCondition,&local_1b0);
    __kjCondition_23 = 5;
    kj::_::Debug::
    log<char_const(&)[87],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x251,ERROR,
               "\"failed: expected \" \"(0u) == (reader.get(\\\"float32List\\\").template as<DynamicList>().size())\", _kjCondition, 0u, reader.get(\"float32List\").template as<DynamicList>().size()"
               ,(char (*) [87])
                "failed: expected (0u) == (reader.get(\"float32List\").template as<DynamicList>().size())"
               ,(DebugComparison<unsigned_int,_unsigned_int> *)&subReader,(uint *)&_kjCondition_10,
               (uint *)&_kjCondition_23);
    DynamicValue::Reader::~Reader(&local_1b0);
  }
  name_x00113.content.size_ = 0xc;
  name_x00113.content.ptr = "float64List";
  DynamicStruct::Reader::get(&local_1b0,&reader,name_x00113);
  DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            ((ReaderFor<DynamicList> *)&_kjCondition,&local_1b0);
  subReader.reader.data._0_1_ = '\0';
  subReader.reader.segment = (SegmentReader *)" == ";
  subReader.schema.super_Schema.raw = (Schema)0x500000000;
  subReader.reader.capTable = (CapTableReader *)&DAT_00000005;
  DynamicValue::Reader::~Reader(&local_1b0);
  if (((char)subReader.reader.data == '\0') && (kj::_::Debug::minSeverity < 3)) {
    auVar49._12_4_ = 0;
    auVar49._0_12_ = stack0xffffffffffffff1c;
    __kjCondition_10 = (ArrayPtr<const_unsigned_char>)(auVar49 << 0x20);
    name_x00114.content.size_ = 0xc;
    name_x00114.content.ptr = "float64List";
    DynamicStruct::Reader::get(&local_1b0,&reader,name_x00114);
    DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
              ((ReaderFor<DynamicList> *)&_kjCondition,&local_1b0);
    __kjCondition_23 = 5;
    kj::_::Debug::
    log<char_const(&)[87],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x252,ERROR,
               "\"failed: expected \" \"(0u) == (reader.get(\\\"float64List\\\").template as<DynamicList>().size())\", _kjCondition, 0u, reader.get(\"float64List\").template as<DynamicList>().size()"
               ,(char (*) [87])
                "failed: expected (0u) == (reader.get(\"float64List\").template as<DynamicList>().size())"
               ,(DebugComparison<unsigned_int,_unsigned_int> *)&subReader,(uint *)&_kjCondition_10,
               (uint *)&_kjCondition_23);
    DynamicValue::Reader::~Reader(&local_1b0);
  }
  name_x00115.content.size_ = 9;
  name_x00115.content.ptr = "textList";
  DynamicStruct::Reader::get(&local_1b0,&reader,name_x00115);
  DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            ((ReaderFor<DynamicList> *)&_kjCondition,&local_1b0);
  subReader.reader.data._0_1_ = '\0';
  subReader.reader.segment = (SegmentReader *)" == ";
  subReader.schema.super_Schema.raw = (Schema)0x500000000;
  subReader.reader.capTable = (CapTableReader *)&DAT_00000005;
  DynamicValue::Reader::~Reader(&local_1b0);
  if (((char)subReader.reader.data == '\0') && (kj::_::Debug::minSeverity < 3)) {
    auVar50._12_4_ = 0;
    auVar50._0_12_ = stack0xffffffffffffff1c;
    __kjCondition_10 = (ArrayPtr<const_unsigned_char>)(auVar50 << 0x20);
    name_x00116.content.size_ = 9;
    name_x00116.content.ptr = "textList";
    DynamicStruct::Reader::get(&local_1b0,&reader,name_x00116);
    DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
              ((ReaderFor<DynamicList> *)&_kjCondition,&local_1b0);
    __kjCondition_23 = 5;
    kj::_::Debug::
    log<char_const(&)[84],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x253,ERROR,
               "\"failed: expected \" \"(0u) == (reader.get(\\\"textList\\\").template as<DynamicList>().size())\", _kjCondition, 0u, reader.get(\"textList\").template as<DynamicList>().size()"
               ,(char (*) [84])
                "failed: expected (0u) == (reader.get(\"textList\").template as<DynamicList>().size())"
               ,(DebugComparison<unsigned_int,_unsigned_int> *)&subReader,(uint *)&_kjCondition_10,
               (uint *)&_kjCondition_23);
    DynamicValue::Reader::~Reader(&local_1b0);
  }
  name_x00117.content.size_ = 9;
  name_x00117.content.ptr = "dataList";
  DynamicStruct::Reader::get(&local_1b0,&reader,name_x00117);
  DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            ((ReaderFor<DynamicList> *)&_kjCondition,&local_1b0);
  subReader.reader.data._0_1_ = '\0';
  subReader.reader.segment = (SegmentReader *)" == ";
  subReader.schema.super_Schema.raw = (Schema)0x500000000;
  subReader.reader.capTable = (CapTableReader *)&DAT_00000005;
  DynamicValue::Reader::~Reader(&local_1b0);
  if (((char)subReader.reader.data == '\0') && (kj::_::Debug::minSeverity < 3)) {
    auVar51._12_4_ = 0;
    auVar51._0_12_ = stack0xffffffffffffff1c;
    __kjCondition_10 = (ArrayPtr<const_unsigned_char>)(auVar51 << 0x20);
    name_x00118.content.size_ = 9;
    name_x00118.content.ptr = "dataList";
    DynamicStruct::Reader::get(&local_1b0,&reader,name_x00118);
    DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
              ((ReaderFor<DynamicList> *)&_kjCondition,&local_1b0);
    __kjCondition_23 = 5;
    kj::_::Debug::
    log<char_const(&)[84],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x254,ERROR,
               "\"failed: expected \" \"(0u) == (reader.get(\\\"dataList\\\").template as<DynamicList>().size())\", _kjCondition, 0u, reader.get(\"dataList\").template as<DynamicList>().size()"
               ,(char (*) [84])
                "failed: expected (0u) == (reader.get(\"dataList\").template as<DynamicList>().size())"
               ,(DebugComparison<unsigned_int,_unsigned_int> *)&subReader,(uint *)&_kjCondition_10,
               (uint *)&_kjCondition_23);
    DynamicValue::Reader::~Reader(&local_1b0);
  }
  name_x00119.content.size_ = 0xb;
  name_x00119.content.ptr = "structList";
  DynamicStruct::Reader::get(&local_1b0,&reader,name_x00119);
  DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            ((ReaderFor<DynamicList> *)&_kjCondition,&local_1b0);
  subReader.reader.data._0_1_ = '\0';
  subReader.reader.segment = (SegmentReader *)" == ";
  subReader.schema.super_Schema.raw = (Schema)0x500000000;
  subReader.reader.capTable = (CapTableReader *)&DAT_00000005;
  DynamicValue::Reader::~Reader(&local_1b0);
  if (((char)subReader.reader.data == '\0') && (kj::_::Debug::minSeverity < 3)) {
    auVar52._12_4_ = 0;
    auVar52._0_12_ = stack0xffffffffffffff1c;
    __kjCondition_10 = (ArrayPtr<const_unsigned_char>)(auVar52 << 0x20);
    name_x00120.content.size_ = 0xb;
    name_x00120.content.ptr = "structList";
    DynamicStruct::Reader::get(&local_1b0,&reader,name_x00120);
    DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
              ((ReaderFor<DynamicList> *)&_kjCondition,&local_1b0);
    __kjCondition_23 = 5;
    kj::_::Debug::
    log<char_const(&)[86],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x255,ERROR,
               "\"failed: expected \" \"(0u) == (reader.get(\\\"structList\\\").template as<DynamicList>().size())\", _kjCondition, 0u, reader.get(\"structList\").template as<DynamicList>().size()"
               ,(char (*) [86])
                "failed: expected (0u) == (reader.get(\"structList\").template as<DynamicList>().size())"
               ,(DebugComparison<unsigned_int,_unsigned_int> *)&subReader,(uint *)&_kjCondition_10,
               (uint *)&_kjCondition_23);
    DynamicValue::Reader::~Reader(&local_1b0);
  }
  return;
}

Assistant:

void dynamicCheckTestMessageAllZero(Reader reader) {
  EXPECT_EQ(VOID, reader.get("voidField").as<Void>());
  EXPECT_EQ(false, reader.get("boolField").as<bool>());
  EXPECT_EQ(0, reader.get("int8Field").as<int8_t>());
  EXPECT_EQ(0, reader.get("int16Field").as<int16_t>());
  EXPECT_EQ(0, reader.get("int32Field").as<int32_t>());
  EXPECT_EQ(0, reader.get("int64Field").as<int64_t>());
  EXPECT_EQ(0u, reader.get("uInt8Field").as<uint8_t>());
  EXPECT_EQ(0u, reader.get("uInt16Field").as<uint16_t>());
  EXPECT_EQ(0u, reader.get("uInt32Field").as<uint32_t>());
  EXPECT_EQ(0u, reader.get("uInt64Field").as<uint64_t>());
  EXPECT_FLOAT_EQ(0, reader.get("float32Field").as<float>());
  EXPECT_DOUBLE_EQ(0, reader.get("float64Field").as<double>());
  EXPECT_EQ("", reader.get("textField").as<Text>());
  EXPECT_EQ(data(""), reader.get("dataField").as<Data>());
  {
    auto subReader = reader.get("structField").as<DynamicStruct>();
    EXPECT_EQ(VOID, subReader.get("voidField").as<Void>());
    EXPECT_EQ(false, subReader.get("boolField").as<bool>());
    EXPECT_EQ(0, subReader.get("int8Field").as<int8_t>());
    EXPECT_EQ(0, subReader.get("int16Field").as<int16_t>());
    EXPECT_EQ(0, subReader.get("int32Field").as<int32_t>());
    EXPECT_EQ(0, subReader.get("int64Field").as<int64_t>());
    EXPECT_EQ(0u, subReader.get("uInt8Field").as<uint8_t>());
    EXPECT_EQ(0u, subReader.get("uInt16Field").as<uint16_t>());
    EXPECT_EQ(0u, subReader.get("uInt32Field").as<uint32_t>());
    EXPECT_EQ(0u, subReader.get("uInt64Field").as<uint64_t>());
    EXPECT_FLOAT_EQ(0, subReader.get("float32Field").as<float>());
    EXPECT_DOUBLE_EQ(0, subReader.get("float64Field").as<double>());
    EXPECT_EQ("", subReader.get("textField").as<Text>());
    EXPECT_EQ(data(""), subReader.get("dataField").as<Data>());
    {
      auto subSubReader = subReader.get("structField").as<DynamicStruct>();
      EXPECT_EQ("", subSubReader.get("textField").as<Text>());
      EXPECT_EQ("", subSubReader.get("structField").as<DynamicStruct>()
                                .get("textField").as<Text>());
    }

    EXPECT_EQ(0u, subReader.get("voidList").as<DynamicList>().size());
    EXPECT_EQ(0u, subReader.get("boolList").as<DynamicList>().size());
    EXPECT_EQ(0u, subReader.get("int8List").as<DynamicList>().size());
    EXPECT_EQ(0u, subReader.get("int16List").as<DynamicList>().size());
    EXPECT_EQ(0u, subReader.get("int32List").as<DynamicList>().size());
    EXPECT_EQ(0u, subReader.get("int64List").as<DynamicList>().size());
    EXPECT_EQ(0u, subReader.get("uInt8List").as<DynamicList>().size());
    EXPECT_EQ(0u, subReader.get("uInt16List").as<DynamicList>().size());
    EXPECT_EQ(0u, subReader.get("uInt32List").as<DynamicList>().size());
    EXPECT_EQ(0u, subReader.get("uInt64List").as<DynamicList>().size());
    EXPECT_EQ(0u, subReader.get("float32List").as<DynamicList>().size());
    EXPECT_EQ(0u, subReader.get("float64List").as<DynamicList>().size());
    EXPECT_EQ(0u, subReader.get("textList").as<DynamicList>().size());
    EXPECT_EQ(0u, subReader.get("dataList").as<DynamicList>().size());
    EXPECT_EQ(0u, subReader.get("structList").as<DynamicList>().size());
  }

  EXPECT_EQ(0u, reader.get("voidList").as<DynamicList>().size());
  EXPECT_EQ(0u, reader.get("boolList").as<DynamicList>().size());
  EXPECT_EQ(0u, reader.get("int8List").as<DynamicList>().size());
  EXPECT_EQ(0u, reader.get("int16List").as<DynamicList>().size());
  EXPECT_EQ(0u, reader.get("int32List").as<DynamicList>().size());
  EXPECT_EQ(0u, reader.get("int64List").as<DynamicList>().size());
  EXPECT_EQ(0u, reader.get("uInt8List").as<DynamicList>().size());
  EXPECT_EQ(0u, reader.get("uInt16List").as<DynamicList>().size());
  EXPECT_EQ(0u, reader.get("uInt32List").as<DynamicList>().size());
  EXPECT_EQ(0u, reader.get("uInt64List").as<DynamicList>().size());
  EXPECT_EQ(0u, reader.get("float32List").as<DynamicList>().size());
  EXPECT_EQ(0u, reader.get("float64List").as<DynamicList>().size());
  EXPECT_EQ(0u, reader.get("textList").as<DynamicList>().size());
  EXPECT_EQ(0u, reader.get("dataList").as<DynamicList>().size());
  EXPECT_EQ(0u, reader.get("structList").as<DynamicList>().size());
}